

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  undefined4 uVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ulong uVar36;
  undefined8 uVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined1 auVar98 [32];
  byte bVar99;
  ulong uVar100;
  uint uVar101;
  uint uVar102;
  int iVar103;
  ulong uVar104;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  uint uVar105;
  ulong uVar106;
  long lVar107;
  Geometry *pGVar108;
  byte bVar109;
  float fVar110;
  float fVar111;
  float fVar162;
  float fVar163;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar119 [16];
  float fVar164;
  float fVar166;
  float fVar167;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar165;
  float fVar168;
  float fVar169;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar170;
  undefined4 uVar171;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  undefined1 auVar183 [64];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar188;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar196;
  float fVar197;
  float fVar207;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [64];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  RTCFilterFunctionNArguments local_840;
  undefined1 (*local_810) [32];
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined8 local_7a0;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  undefined1 local_700 [64];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  int local_55c;
  undefined1 local_550 [16];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  undefined1 auVar238 [64];
  
  PVar14 = prim[1];
  uVar104 = (ulong)(byte)PVar14;
  fVar188 = *(float *)(prim + uVar104 * 0x19 + 0x12);
  auVar32 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar32 = vinsertps_avx(auVar32,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar116 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar174 = vsubps_avx(auVar32,*(undefined1 (*) [16])(prim + uVar104 * 0x19 + 6));
  fVar196 = fVar188 * auVar174._0_4_;
  fVar170 = fVar188 * auVar116._0_4_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar104 * 4 + 6);
  auVar125 = vpmovsxbd_avx2(auVar32);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar104 * 5 + 6);
  auVar123 = vpmovsxbd_avx2(auVar117);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar104 * 6 + 6);
  auVar136 = vpmovsxbd_avx2(auVar118);
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar135 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar14 * 0xc) + 6);
  auVar129 = vpmovsxbd_avx2(auVar9);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar126 = vcvtdq2ps_avx(auVar129);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (uint)(byte)PVar14 * 0xc + uVar104 + 6);
  auVar124 = vpmovsxbd_avx2(auVar10);
  auVar124 = vcvtdq2ps_avx(auVar124);
  uVar106 = (ulong)(uint)((int)(uVar104 * 9) * 2);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar106 + 6);
  auVar127 = vpmovsxbd_avx2(auVar11);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar106 + uVar104 + 6);
  auVar134 = vpmovsxbd_avx2(auVar12);
  auVar134 = vcvtdq2ps_avx(auVar134);
  uVar100 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar122 = vpmovsxbd_avx2(auVar13);
  auVar128 = vcvtdq2ps_avx(auVar122);
  auVar231._4_4_ = fVar170;
  auVar231._0_4_ = fVar170;
  auVar231._8_4_ = fVar170;
  auVar231._12_4_ = fVar170;
  auVar231._16_4_ = fVar170;
  auVar231._20_4_ = fVar170;
  auVar231._24_4_ = fVar170;
  auVar231._28_4_ = fVar170;
  auVar233._8_4_ = 1;
  auVar233._0_8_ = 0x100000001;
  auVar233._12_4_ = 1;
  auVar233._16_4_ = 1;
  auVar233._20_4_ = 1;
  auVar233._24_4_ = 1;
  auVar233._28_4_ = 1;
  auVar120 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar131 = ZEXT1632(CONCAT412(fVar188 * auVar116._12_4_,
                                CONCAT48(fVar188 * auVar116._8_4_,
                                         CONCAT44(fVar188 * auVar116._4_4_,fVar170))));
  auVar130 = vpermps_avx2(auVar233,auVar131);
  auVar121 = vpermps_avx512vl(auVar120,auVar131);
  fVar170 = auVar121._0_4_;
  fVar184 = auVar121._4_4_;
  auVar131._4_4_ = fVar184 * auVar136._4_4_;
  auVar131._0_4_ = fVar170 * auVar136._0_4_;
  fVar185 = auVar121._8_4_;
  auVar131._8_4_ = fVar185 * auVar136._8_4_;
  fVar197 = auVar121._12_4_;
  auVar131._12_4_ = fVar197 * auVar136._12_4_;
  fVar207 = auVar121._16_4_;
  auVar131._16_4_ = fVar207 * auVar136._16_4_;
  fVar110 = auVar121._20_4_;
  auVar131._20_4_ = fVar110 * auVar136._20_4_;
  fVar111 = auVar121._24_4_;
  auVar131._24_4_ = fVar111 * auVar136._24_4_;
  auVar131._28_4_ = auVar129._28_4_;
  auVar129._4_4_ = auVar124._4_4_ * fVar184;
  auVar129._0_4_ = auVar124._0_4_ * fVar170;
  auVar129._8_4_ = auVar124._8_4_ * fVar185;
  auVar129._12_4_ = auVar124._12_4_ * fVar197;
  auVar129._16_4_ = auVar124._16_4_ * fVar207;
  auVar129._20_4_ = auVar124._20_4_ * fVar110;
  auVar129._24_4_ = auVar124._24_4_ * fVar111;
  auVar129._28_4_ = auVar122._28_4_;
  auVar122._4_4_ = auVar128._4_4_ * fVar184;
  auVar122._0_4_ = auVar128._0_4_ * fVar170;
  auVar122._8_4_ = auVar128._8_4_ * fVar185;
  auVar122._12_4_ = auVar128._12_4_ * fVar197;
  auVar122._16_4_ = auVar128._16_4_ * fVar207;
  auVar122._20_4_ = auVar128._20_4_ * fVar110;
  auVar122._24_4_ = auVar128._24_4_ * fVar111;
  auVar122._28_4_ = auVar121._28_4_;
  auVar32 = vfmadd231ps_fma(auVar131,auVar130,auVar123);
  auVar117 = vfmadd231ps_fma(auVar129,auVar130,auVar126);
  auVar118 = vfmadd231ps_fma(auVar122,auVar134,auVar130);
  auVar32 = vfmadd231ps_fma(ZEXT1632(auVar32),auVar231,auVar125);
  auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar231,auVar135);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar127,auVar231);
  auVar232._4_4_ = fVar196;
  auVar232._0_4_ = fVar196;
  auVar232._8_4_ = fVar196;
  auVar232._12_4_ = fVar196;
  auVar232._16_4_ = fVar196;
  auVar232._20_4_ = fVar196;
  auVar232._24_4_ = fVar196;
  auVar232._28_4_ = fVar196;
  auVar122 = ZEXT1632(CONCAT412(fVar188 * auVar174._12_4_,
                                CONCAT48(fVar188 * auVar174._8_4_,
                                         CONCAT44(fVar188 * auVar174._4_4_,fVar196))));
  auVar129 = vpermps_avx2(auVar233,auVar122);
  auVar122 = vpermps_avx512vl(auVar120,auVar122);
  fVar188 = auVar122._0_4_;
  fVar170 = auVar122._4_4_;
  auVar130._4_4_ = fVar170 * auVar136._4_4_;
  auVar130._0_4_ = fVar188 * auVar136._0_4_;
  fVar184 = auVar122._8_4_;
  auVar130._8_4_ = fVar184 * auVar136._8_4_;
  fVar185 = auVar122._12_4_;
  auVar130._12_4_ = fVar185 * auVar136._12_4_;
  fVar197 = auVar122._16_4_;
  auVar130._16_4_ = fVar197 * auVar136._16_4_;
  fVar207 = auVar122._20_4_;
  auVar130._20_4_ = fVar207 * auVar136._20_4_;
  fVar110 = auVar122._24_4_;
  auVar130._24_4_ = fVar110 * auVar136._24_4_;
  auVar130._28_4_ = 1;
  auVar120._4_4_ = auVar124._4_4_ * fVar170;
  auVar120._0_4_ = auVar124._0_4_ * fVar188;
  auVar120._8_4_ = auVar124._8_4_ * fVar184;
  auVar120._12_4_ = auVar124._12_4_ * fVar185;
  auVar120._16_4_ = auVar124._16_4_ * fVar197;
  auVar120._20_4_ = auVar124._20_4_ * fVar207;
  auVar120._24_4_ = auVar124._24_4_ * fVar110;
  auVar120._28_4_ = auVar136._28_4_;
  auVar124._4_4_ = auVar128._4_4_ * fVar170;
  auVar124._0_4_ = auVar128._0_4_ * fVar188;
  auVar124._8_4_ = auVar128._8_4_ * fVar184;
  auVar124._12_4_ = auVar128._12_4_ * fVar185;
  auVar124._16_4_ = auVar128._16_4_ * fVar197;
  auVar124._20_4_ = auVar128._20_4_ * fVar207;
  auVar124._24_4_ = auVar128._24_4_ * fVar110;
  auVar124._28_4_ = auVar122._28_4_;
  auVar8 = vfmadd231ps_fma(auVar130,auVar129,auVar123);
  auVar9 = vfmadd231ps_fma(auVar120,auVar129,auVar126);
  auVar10 = vfmadd231ps_fma(auVar124,auVar129,auVar134);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar232,auVar125);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar232,auVar135);
  auVar221._8_4_ = 0x7fffffff;
  auVar221._0_8_ = 0x7fffffff7fffffff;
  auVar221._12_4_ = 0x7fffffff;
  auVar221._16_4_ = 0x7fffffff;
  auVar221._20_4_ = 0x7fffffff;
  auVar221._24_4_ = 0x7fffffff;
  auVar221._28_4_ = 0x7fffffff;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar232,auVar127);
  auVar125 = vandps_avx(ZEXT1632(auVar32),auVar221);
  auVar219._8_4_ = 0x219392ef;
  auVar219._0_8_ = 0x219392ef219392ef;
  auVar219._12_4_ = 0x219392ef;
  auVar219._16_4_ = 0x219392ef;
  auVar219._20_4_ = 0x219392ef;
  auVar219._24_4_ = 0x219392ef;
  auVar219._28_4_ = 0x219392ef;
  uVar106 = vcmpps_avx512vl(auVar125,auVar219,1);
  bVar18 = (bool)((byte)uVar106 & 1);
  auVar121._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._0_4_;
  bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
  auVar121._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._4_4_;
  bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
  auVar121._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._8_4_;
  bVar18 = (bool)((byte)(uVar106 >> 3) & 1);
  auVar121._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar32._12_4_;
  auVar121._16_4_ = (uint)((byte)(uVar106 >> 4) & 1) * 0x219392ef;
  auVar121._20_4_ = (uint)((byte)(uVar106 >> 5) & 1) * 0x219392ef;
  auVar121._24_4_ = (uint)((byte)(uVar106 >> 6) & 1) * 0x219392ef;
  auVar121._28_4_ = (uint)(byte)(uVar106 >> 7) * 0x219392ef;
  auVar125 = vandps_avx(ZEXT1632(auVar117),auVar221);
  uVar106 = vcmpps_avx512vl(auVar125,auVar219,1);
  bVar18 = (bool)((byte)uVar106 & 1);
  auVar132._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar117._0_4_;
  bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
  auVar132._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar117._4_4_;
  bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
  auVar132._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar117._8_4_;
  bVar18 = (bool)((byte)(uVar106 >> 3) & 1);
  auVar132._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar117._12_4_;
  auVar132._16_4_ = (uint)((byte)(uVar106 >> 4) & 1) * 0x219392ef;
  auVar132._20_4_ = (uint)((byte)(uVar106 >> 5) & 1) * 0x219392ef;
  auVar132._24_4_ = (uint)((byte)(uVar106 >> 6) & 1) * 0x219392ef;
  auVar132._28_4_ = (uint)(byte)(uVar106 >> 7) * 0x219392ef;
  auVar125 = vandps_avx(ZEXT1632(auVar118),auVar221);
  uVar106 = vcmpps_avx512vl(auVar125,auVar219,1);
  bVar18 = (bool)((byte)uVar106 & 1);
  auVar125._0_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar118._0_4_;
  bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
  auVar125._4_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar118._4_4_;
  bVar18 = (bool)((byte)(uVar106 >> 2) & 1);
  auVar125._8_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar118._8_4_;
  bVar18 = (bool)((byte)(uVar106 >> 3) & 1);
  auVar125._12_4_ = (uint)bVar18 * 0x219392ef | (uint)!bVar18 * auVar118._12_4_;
  auVar125._16_4_ = (uint)((byte)(uVar106 >> 4) & 1) * 0x219392ef;
  auVar125._20_4_ = (uint)((byte)(uVar106 >> 5) & 1) * 0x219392ef;
  auVar125._24_4_ = (uint)((byte)(uVar106 >> 6) & 1) * 0x219392ef;
  auVar125._28_4_ = (uint)(byte)(uVar106 >> 7) * 0x219392ef;
  auVar123 = vrcp14ps_avx512vl(auVar121);
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = 0x3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar220._16_4_ = 0x3f800000;
  auVar220._20_4_ = 0x3f800000;
  auVar220._24_4_ = 0x3f800000;
  auVar220._28_4_ = 0x3f800000;
  auVar32 = vfnmadd213ps_fma(auVar121,auVar123,auVar220);
  auVar32 = vfmadd132ps_fma(ZEXT1632(auVar32),auVar123,auVar123);
  auVar123 = vrcp14ps_avx512vl(auVar132);
  auVar117 = vfnmadd213ps_fma(auVar132,auVar123,auVar220);
  auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar123,auVar123);
  auVar123 = vrcp14ps_avx512vl(auVar125);
  auVar118 = vfnmadd213ps_fma(auVar125,auVar123,auVar220);
  auVar118 = vfmadd132ps_fma(ZEXT1632(auVar118),auVar123,auVar123);
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 7 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar8));
  auVar127._4_4_ = auVar32._4_4_ * auVar125._4_4_;
  auVar127._0_4_ = auVar32._0_4_ * auVar125._0_4_;
  auVar127._8_4_ = auVar32._8_4_ * auVar125._8_4_;
  auVar127._12_4_ = auVar32._12_4_ * auVar125._12_4_;
  auVar127._16_4_ = auVar125._16_4_ * 0.0;
  auVar127._20_4_ = auVar125._20_4_ * 0.0;
  auVar127._24_4_ = auVar125._24_4_ * 0.0;
  auVar127._28_4_ = auVar125._28_4_;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 9 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar8));
  auVar124 = vpbroadcastd_avx512vl();
  auVar123 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar14 * 0x10 + 6));
  auVar193._0_4_ = auVar32._0_4_ * auVar125._0_4_;
  auVar193._4_4_ = auVar32._4_4_ * auVar125._4_4_;
  auVar193._8_4_ = auVar32._8_4_ * auVar125._8_4_;
  auVar193._12_4_ = auVar32._12_4_ * auVar125._12_4_;
  auVar193._16_4_ = auVar125._16_4_ * 0.0;
  auVar193._20_4_ = auVar125._20_4_ * 0.0;
  auVar193._24_4_ = auVar125._24_4_ * 0.0;
  auVar193._28_4_ = 0;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar14 * 0x10 + uVar104 * -2 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar9));
  auVar134._4_4_ = auVar117._4_4_ * auVar125._4_4_;
  auVar134._0_4_ = auVar117._0_4_ * auVar125._0_4_;
  auVar134._8_4_ = auVar117._8_4_ * auVar125._8_4_;
  auVar134._12_4_ = auVar117._12_4_ * auVar125._12_4_;
  auVar134._16_4_ = auVar125._16_4_ * 0.0;
  auVar134._20_4_ = auVar125._20_4_ * 0.0;
  auVar134._24_4_ = auVar125._24_4_ * 0.0;
  auVar134._28_4_ = auVar125._28_4_;
  auVar125 = vcvtdq2ps_avx(auVar123);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar9));
  auVar186._0_4_ = auVar117._0_4_ * auVar125._0_4_;
  auVar186._4_4_ = auVar117._4_4_ * auVar125._4_4_;
  auVar186._8_4_ = auVar117._8_4_ * auVar125._8_4_;
  auVar186._12_4_ = auVar117._12_4_ * auVar125._12_4_;
  auVar186._16_4_ = auVar125._16_4_ * 0.0;
  auVar186._20_4_ = auVar125._20_4_ * 0.0;
  auVar186._24_4_ = auVar125._24_4_ * 0.0;
  auVar186._28_4_ = 0;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 + uVar104 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar10));
  auVar128._4_4_ = auVar125._4_4_ * auVar118._4_4_;
  auVar128._0_4_ = auVar125._0_4_ * auVar118._0_4_;
  auVar128._8_4_ = auVar125._8_4_ * auVar118._8_4_;
  auVar128._12_4_ = auVar125._12_4_ * auVar118._12_4_;
  auVar128._16_4_ = auVar125._16_4_ * 0.0;
  auVar128._20_4_ = auVar125._20_4_ * 0.0;
  auVar128._24_4_ = auVar125._24_4_ * 0.0;
  auVar128._28_4_ = auVar125._28_4_;
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar104 * 0x17 + 6));
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar125 = vsubps_avx(auVar125,ZEXT1632(auVar10));
  auVar133._0_4_ = auVar118._0_4_ * auVar125._0_4_;
  auVar133._4_4_ = auVar118._4_4_ * auVar125._4_4_;
  auVar133._8_4_ = auVar118._8_4_ * auVar125._8_4_;
  auVar133._12_4_ = auVar118._12_4_ * auVar125._12_4_;
  auVar133._16_4_ = auVar125._16_4_ * 0.0;
  auVar133._20_4_ = auVar125._20_4_ * 0.0;
  auVar133._24_4_ = auVar125._24_4_ * 0.0;
  auVar133._28_4_ = 0;
  auVar125 = vpminsd_avx2(auVar127,auVar193);
  auVar123 = vpminsd_avx2(auVar134,auVar186);
  auVar125 = vmaxps_avx(auVar125,auVar123);
  auVar123 = vpminsd_avx2(auVar128,auVar133);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar136._4_4_ = uVar171;
  auVar136._0_4_ = uVar171;
  auVar136._8_4_ = uVar171;
  auVar136._12_4_ = uVar171;
  auVar136._16_4_ = uVar171;
  auVar136._20_4_ = uVar171;
  auVar136._24_4_ = uVar171;
  auVar136._28_4_ = uVar171;
  auVar123 = vmaxps_avx512vl(auVar123,auVar136);
  auVar125 = vmaxps_avx(auVar125,auVar123);
  auVar123._8_4_ = 0x3f7ffffa;
  auVar123._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar123._12_4_ = 0x3f7ffffa;
  auVar123._16_4_ = 0x3f7ffffa;
  auVar123._20_4_ = 0x3f7ffffa;
  auVar123._24_4_ = 0x3f7ffffa;
  auVar123._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar125,auVar123);
  auVar125 = vpmaxsd_avx2(auVar127,auVar193);
  auVar123 = vpmaxsd_avx2(auVar134,auVar186);
  auVar125 = vminps_avx(auVar125,auVar123);
  auVar123 = vpmaxsd_avx2(auVar128,auVar133);
  uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar135._4_4_ = uVar171;
  auVar135._0_4_ = uVar171;
  auVar135._8_4_ = uVar171;
  auVar135._12_4_ = uVar171;
  auVar135._16_4_ = uVar171;
  auVar135._20_4_ = uVar171;
  auVar135._24_4_ = uVar171;
  auVar135._28_4_ = uVar171;
  auVar123 = vminps_avx512vl(auVar123,auVar135);
  auVar125 = vminps_avx(auVar125,auVar123);
  auVar126._8_4_ = 0x3f800003;
  auVar126._0_8_ = 0x3f8000033f800003;
  auVar126._12_4_ = 0x3f800003;
  auVar126._16_4_ = 0x3f800003;
  auVar126._20_4_ = 0x3f800003;
  auVar126._24_4_ = 0x3f800003;
  auVar126._28_4_ = 0x3f800003;
  auVar125 = vmulps_avx512vl(auVar125,auVar126);
  uVar37 = vpcmpgtd_avx512vl(auVar124,_DAT_01fe9900);
  uVar33 = vcmpps_avx512vl(local_320,auVar125,2);
  if ((byte)((byte)uVar33 & (byte)uVar37) != 0) {
    uVar106 = (ulong)(byte)((byte)uVar33 & (byte)uVar37);
    local_810 = (undefined1 (*) [32])local_100;
    auVar183 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar183);
    do {
      auVar183 = local_440;
      lVar38 = 0;
      for (uVar100 = uVar106; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar105 = *(uint *)(prim + 2);
      uVar15 = *(uint *)(prim + lVar38 * 4 + 6);
      pGVar108 = (context->scene->geometries).items[uVar105].ptr;
      uVar100 = (ulong)*(uint *)(*(long *)&pGVar108->field_0x58 +
                                pGVar108[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar15);
      p_Var17 = pGVar108[1].intersectionFilterN;
      lVar38 = *(long *)&pGVar108[1].time_range.upper;
      auVar32 = *(undefined1 (*) [16])(lVar38 + (long)p_Var17 * uVar100);
      pauVar3 = (undefined1 (*) [16])(lVar38 + (uVar100 + 1) * (long)p_Var17);
      uVar33 = *(undefined8 *)*pauVar3;
      uVar37 = *(undefined8 *)(*pauVar3 + 8);
      auVar13 = *pauVar3;
      auVar11 = *pauVar3;
      auVar9 = *pauVar3;
      auVar117 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar38 + (uVar100 + 2) * (long)p_Var17);
      uVar94 = *(undefined8 *)*pauVar4;
      uVar95 = *(undefined8 *)(*pauVar4 + 8);
      auVar12 = *pauVar4;
      auVar10 = *pauVar4;
      auVar8 = *pauVar4;
      auVar118 = *pauVar4;
      uVar106 = uVar106 - 1 & uVar106;
      pauVar5 = (undefined1 (*) [12])(lVar38 + (uVar100 + 3) * (long)p_Var17);
      uVar96 = *(undefined8 *)*pauVar5;
      uVar97 = *(undefined8 *)(*pauVar5 + 8);
      local_880 = (float)uVar96;
      fStack_87c = (float)((ulong)uVar96 >> 0x20);
      fStack_878 = (float)uVar97;
      fStack_874 = (float)((ulong)uVar97 >> 0x20);
      if (uVar106 != 0) {
        uVar104 = uVar106 - 1 & uVar106;
        for (uVar100 = uVar106; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x8000000000000000) {
        }
        if (uVar104 != 0) {
          for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar103 = (int)pGVar108[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar116 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar116 = vinsertps_avx(auVar116,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar115 = vsubps_avx(auVar32,auVar116);
      uVar171 = auVar115._0_4_;
      auVar112._4_4_ = uVar171;
      auVar112._0_4_ = uVar171;
      auVar112._8_4_ = uVar171;
      auVar112._12_4_ = uVar171;
      auVar174 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      aVar6 = pre->ray_space[k].vx.field_0;
      aVar7 = pre->ray_space[k].vy.field_0;
      fVar188 = pre->ray_space[k].vz.field_0.m128[0];
      fVar170 = pre->ray_space[k].vz.field_0.m128[1];
      fVar184 = pre->ray_space[k].vz.field_0.m128[2];
      fVar185 = pre->ray_space[k].vz.field_0.m128[3];
      auVar223._0_4_ = fVar188 * auVar115._0_4_;
      auVar223._4_4_ = fVar170 * auVar115._4_4_;
      auVar223._8_4_ = fVar184 * auVar115._8_4_;
      auVar223._12_4_ = fVar185 * auVar115._12_4_;
      auVar174 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar7,auVar174);
      auVar223 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar6,auVar112);
      auVar174 = vshufps_avx(auVar32,auVar32,0xff);
      auVar112 = vsubps_avx512vl(auVar117,auVar116);
      uVar171 = auVar112._0_4_;
      auVar198._4_4_ = uVar171;
      auVar198._0_4_ = uVar171;
      auVar198._8_4_ = uVar171;
      auVar198._12_4_ = uVar171;
      auVar115 = vshufps_avx(auVar112,auVar112,0x55);
      auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar113._0_4_ = fVar188 * auVar112._0_4_;
      auVar113._4_4_ = fVar170 * auVar112._4_4_;
      auVar113._8_4_ = fVar184 * auVar112._8_4_;
      auVar113._12_4_ = fVar185 * auVar112._12_4_;
      auVar115 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar7,auVar115);
      auVar198 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar6,auVar198);
      auVar113 = vshufps_avx512vl(auVar117,auVar117,0xff);
      auVar112 = vsubps_avx512vl(auVar118,auVar116);
      uVar171 = auVar112._0_4_;
      auVar114._4_4_ = uVar171;
      auVar114._0_4_ = uVar171;
      auVar114._8_4_ = uVar171;
      auVar114._12_4_ = uVar171;
      auVar115 = vshufps_avx(auVar112,auVar112,0x55);
      auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
      auVar227._0_4_ = fVar188 * auVar112._0_4_;
      auVar227._4_4_ = fVar170 * auVar112._4_4_;
      auVar227._8_4_ = fVar184 * auVar112._8_4_;
      auVar227._12_4_ = fVar185 * auVar112._12_4_;
      auVar115 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar7,auVar115);
      auVar112 = vfmadd231ps_fma(auVar115,(undefined1  [16])aVar6,auVar114);
      auVar114 = vshufps_avx512vl(auVar118,auVar118,0xff);
      auVar39._12_4_ = fStack_874;
      auVar39._0_12_ = *pauVar5;
      auVar115 = vsubps_avx512vl(auVar39,auVar116);
      uVar171 = auVar115._0_4_;
      auVar199._4_4_ = uVar171;
      auVar199._0_4_ = uVar171;
      auVar199._8_4_ = uVar171;
      auVar199._12_4_ = uVar171;
      auVar116 = vshufps_avx(auVar115,auVar115,0x55);
      auVar115 = vshufps_avx(auVar115,auVar115,0xaa);
      auVar228._0_4_ = fVar188 * auVar115._0_4_;
      auVar228._4_4_ = fVar170 * auVar115._4_4_;
      auVar228._8_4_ = fVar184 * auVar115._8_4_;
      auVar228._12_4_ = fVar185 * auVar115._12_4_;
      auVar116 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar7,auVar116);
      auVar115 = vfmadd231ps_fma(auVar116,(undefined1  [16])aVar6,auVar199);
      lVar38 = (long)iVar103 * 0x44;
      auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar38);
      auVar116 = vshufps_avx512vl(auVar39,auVar39,0xff);
      uVar171 = auVar223._0_4_;
      local_5e0._4_4_ = uVar171;
      local_5e0._0_4_ = uVar171;
      local_5e0._8_4_ = uVar171;
      local_5e0._12_4_ = uVar171;
      local_5e0._16_4_ = uVar171;
      local_5e0._20_4_ = uVar171;
      local_5e0._24_4_ = uVar171;
      local_5e0._28_4_ = uVar171;
      auVar208._8_4_ = 1;
      auVar208._0_8_ = 0x100000001;
      auVar208._12_4_ = 1;
      auVar208._16_4_ = 1;
      auVar208._20_4_ = 1;
      auVar208._24_4_ = 1;
      auVar208._28_4_ = 1;
      local_600 = vpermps_avx2(auVar208,ZEXT1632(auVar223));
      local_340 = vbroadcastsd_avx512vl(auVar174);
      auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0x484);
      uVar171 = auVar198._0_4_;
      auVar119._4_4_ = uVar171;
      auVar119._0_4_ = uVar171;
      auVar119._8_4_ = uVar171;
      auVar119._12_4_ = uVar171;
      local_620._16_4_ = uVar171;
      local_620._0_16_ = auVar119;
      local_620._20_4_ = uVar171;
      local_620._24_4_ = uVar171;
      local_620._28_4_ = uVar171;
      local_640 = vpermps_avx512vl(auVar208,ZEXT1632(auVar198));
      local_360 = vbroadcastsd_avx512vl(auVar113);
      auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0x908);
      uVar171 = auVar112._0_4_;
      local_660._4_4_ = uVar171;
      local_660._0_4_ = uVar171;
      local_660._8_4_ = uVar171;
      local_660._12_4_ = uVar171;
      local_660._16_4_ = uVar171;
      local_660._20_4_ = uVar171;
      local_660._24_4_ = uVar171;
      local_660._28_4_ = uVar171;
      local_680 = vpermps_avx512vl(auVar208,ZEXT1632(auVar112));
      local_380 = vbroadcastsd_avx512vl(auVar114);
      auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0xd8c);
      fVar170 = auVar115._0_4_;
      local_6a0._4_4_ = fVar170;
      local_6a0._0_4_ = fVar170;
      fStack_698 = fVar170;
      fStack_694 = fVar170;
      fStack_690 = fVar170;
      fStack_68c = fVar170;
      fStack_688 = fVar170;
      register0x0000139c = fVar170;
      _local_6c0 = vpermps_avx512vl(auVar208,ZEXT1632(auVar115));
      local_3a0 = vbroadcastsd_avx512vl(auVar116);
      auVar126 = vmulps_avx512vl(_local_6a0,auVar135);
      auVar124 = vmulps_avx512vl(_local_6c0,auVar135);
      auVar116 = vfmadd231ps_fma(auVar126,auVar136,local_660);
      auVar126 = vfmadd231ps_avx512vl(auVar124,auVar136,local_680);
      auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar123,local_620);
      auVar127 = vfmadd231ps_avx512vl(auVar126,auVar123,local_640);
      auVar128 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),auVar125,local_5e0);
      auVar218 = ZEXT3264(auVar128);
      auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar38);
      auVar124 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0x484);
      auVar129 = vfmadd231ps_avx512vl(auVar127,auVar125,local_600);
      auVar213 = ZEXT3264(auVar129);
      auVar127 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0x908);
      auVar134 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0xd8c);
      auVar122 = vmulps_avx512vl(_local_6a0,auVar134);
      auVar130 = vmulps_avx512vl(_local_6c0,auVar134);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar127,local_660);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar127,local_680);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar124,local_620);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar124,local_640);
      auVar174 = vfmadd231ps_fma(auVar122,auVar126,local_5e0);
      auVar222 = ZEXT1664(auVar174);
      auVar113 = vfmadd231ps_fma(auVar130,auVar126,local_600);
      auVar122 = vsubps_avx512vl(ZEXT1632(auVar174),auVar128);
      auVar130 = vsubps_avx512vl(ZEXT1632(auVar113),auVar129);
      auVar131 = vmulps_avx512vl(auVar129,auVar122);
      auVar120 = vmulps_avx512vl(auVar128,auVar130);
      auVar131 = vsubps_avx512vl(auVar131,auVar120);
      auVar120 = vmulps_avx512vl(local_3a0,auVar135);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar136,local_380);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_360);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,local_340);
      auVar121 = vmulps_avx512vl(local_3a0,auVar134);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar127,local_380);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar124,local_360);
      auVar121 = vfmadd231ps_avx512vl(auVar121,auVar126,local_340);
      auVar132 = vmulps_avx512vl(auVar130,auVar130);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar122,auVar122);
      auVar133 = vmaxps_avx512vl(auVar120,auVar121);
      auVar133 = vmulps_avx512vl(auVar133,auVar133);
      auVar132 = vmulps_avx512vl(auVar133,auVar132);
      auVar131 = vmulps_avx512vl(auVar131,auVar131);
      uVar34 = vcmpps_avx512vl(auVar131,auVar132,2);
      auVar116 = vblendps_avx(auVar223,auVar32,8);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar116 = vandps_avx512vl(auVar116,auVar114);
      auVar117 = vblendps_avx(auVar198,auVar117,8);
      auVar117 = vandps_avx512vl(auVar117,auVar114);
      auVar116 = vmaxps_avx(auVar116,auVar117);
      auVar117 = vblendps_avx(auVar112,auVar118,8);
      auVar118 = vandps_avx512vl(auVar117,auVar114);
      auVar117 = vblendps_avx(auVar115,auVar39,8);
      auVar117 = vandps_avx512vl(auVar117,auVar114);
      auVar117 = vmaxps_avx(auVar118,auVar117);
      auVar117 = vmaxps_avx(auVar116,auVar117);
      auVar118 = vmovshdup_avx(auVar117);
      auVar118 = vmaxss_avx(auVar118,auVar117);
      auVar117 = vshufpd_avx(auVar117,auVar117,1);
      auVar117 = vmaxss_avx(auVar117,auVar118);
      auVar230._0_4_ = (float)iVar103;
      local_440._4_12_ = auVar223._4_12_;
      local_440._0_4_ = auVar230._0_4_;
      local_440._16_48_ = auVar183._16_48_;
      auVar230._4_4_ = auVar230._0_4_;
      auVar230._8_4_ = auVar230._0_4_;
      auVar230._12_4_ = auVar230._0_4_;
      auVar230._16_4_ = auVar230._0_4_;
      auVar230._20_4_ = auVar230._0_4_;
      auVar230._24_4_ = auVar230._0_4_;
      auVar230._28_4_ = auVar230._0_4_;
      uVar35 = vcmpps_avx512vl(auVar230,_DAT_01faff40,0xe);
      bVar109 = (byte)uVar34 & (byte)uVar35;
      fVar188 = auVar117._0_4_ * 4.7683716e-07;
      local_7e0._0_16_ = ZEXT416((uint)fVar188);
      auVar203._8_4_ = 2;
      auVar203._0_8_ = 0x200000002;
      auVar203._12_4_ = 2;
      auVar203._16_4_ = 2;
      auVar203._20_4_ = 2;
      auVar203._24_4_ = 2;
      auVar203._28_4_ = 2;
      local_760 = vpermps_avx512vl(auVar203,ZEXT1632(auVar223));
      auVar183 = ZEXT3264(local_760);
      local_780 = vpermps_avx512vl(auVar203,ZEXT1632(auVar198));
      auVar240 = ZEXT3264(local_780);
      auVar131 = vpermps_avx512vl(auVar203,ZEXT1632(auVar112));
      local_4a0 = vpermps_avx2(auVar203,ZEXT1632(auVar115));
      local_720 = *(undefined4 *)(ray + k * 4 + 0xc0);
      uStack_71c = 0;
      uStack_718 = 0;
      uStack_714 = 0;
      if (bVar109 != 0) {
        auVar134 = vmulps_avx512vl(local_4a0,auVar134);
        auVar127 = vfmadd213ps_avx512vl(auVar127,auVar131,auVar134);
        auVar124 = vfmadd213ps_avx512vl(auVar124,local_780,auVar127);
        auVar124 = vfmadd213ps_avx512vl(auVar126,local_760,auVar124);
        auVar135 = vmulps_avx512vl(local_4a0,auVar135);
        auVar136 = vfmadd213ps_avx512vl(auVar136,auVar131,auVar135);
        auVar127 = vfmadd213ps_avx512vl(auVar123,local_780,auVar136);
        auVar123 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0x1210);
        auVar136 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0x1694);
        auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0x1b18);
        auVar126 = *(undefined1 (*) [32])(bezier_basis0 + lVar38 + 0x1f9c);
        auVar127 = vfmadd213ps_avx512vl(auVar125,local_760,auVar127);
        auVar225._0_4_ = fVar170 * auVar126._0_4_;
        auVar225._4_4_ = fVar170 * auVar126._4_4_;
        auVar225._8_4_ = fVar170 * auVar126._8_4_;
        auVar225._12_4_ = fVar170 * auVar126._12_4_;
        auVar225._16_4_ = fVar170 * auVar126._16_4_;
        auVar225._20_4_ = fVar170 * auVar126._20_4_;
        auVar225._24_4_ = fVar170 * auVar126._24_4_;
        auVar225._28_4_ = 0;
        auVar125 = vmulps_avx512vl(_local_6c0,auVar126);
        auVar126 = vmulps_avx512vl(local_4a0,auVar126);
        auVar134 = vfmadd231ps_avx512vl(auVar225,auVar135,local_660);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar135,local_680);
        auVar135 = vfmadd231ps_avx512vl(auVar126,auVar131,auVar135);
        auVar126 = vfmadd231ps_avx512vl(auVar134,auVar136,local_620);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar136,local_640);
        auVar134 = vfmadd231ps_avx512vl(auVar135,local_780,auVar136);
        auVar117 = vfmadd231ps_fma(auVar126,auVar123,local_5e0);
        auVar126 = vfmadd231ps_avx512vl(auVar125,auVar123,local_600);
        auVar125 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0x1210);
        auVar136 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0x1b18);
        auVar135 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0x1f9c);
        auVar134 = vfmadd231ps_avx512vl(auVar134,local_760,auVar123);
        auVar47._4_4_ = fVar170 * auVar135._4_4_;
        auVar47._0_4_ = fVar170 * auVar135._0_4_;
        auVar47._8_4_ = fVar170 * auVar135._8_4_;
        auVar47._12_4_ = fVar170 * auVar135._12_4_;
        auVar47._16_4_ = fVar170 * auVar135._16_4_;
        auVar47._20_4_ = fVar170 * auVar135._20_4_;
        auVar47._24_4_ = fVar170 * auVar135._24_4_;
        auVar47._28_4_ = auVar123._28_4_;
        auVar123 = vmulps_avx512vl(_local_6c0,auVar135);
        auVar135 = vmulps_avx512vl(local_4a0,auVar135);
        auVar132 = vfmadd231ps_avx512vl(auVar47,auVar136,local_660);
        auVar133 = vfmadd231ps_avx512vl(auVar123,auVar136,local_680);
        auVar183 = ZEXT3264(local_760);
        auVar240 = ZEXT3264(local_780);
        auVar239 = ZEXT3264(auVar131);
        auVar136 = vfmadd231ps_avx512vl(auVar135,auVar131,auVar136);
        auVar123 = *(undefined1 (*) [32])(bezier_basis1 + lVar38 + 0x1694);
        auVar135 = vfmadd231ps_avx512vl(auVar132,auVar123,local_620);
        auVar132 = vfmadd231ps_avx512vl(auVar133,auVar123,local_640);
        auVar123 = vfmadd231ps_avx512vl(auVar136,local_780,auVar123);
        auVar118 = vfmadd231ps_fma(auVar135,auVar125,local_5e0);
        auVar136 = vfmadd231ps_avx512vl(auVar132,auVar125,local_600);
        auVar135 = vfmadd231ps_avx512vl(auVar123,local_760,auVar125);
        auVar234._8_4_ = 0x7fffffff;
        auVar234._0_8_ = 0x7fffffff7fffffff;
        auVar234._12_4_ = 0x7fffffff;
        auVar234._16_4_ = 0x7fffffff;
        auVar234._20_4_ = 0x7fffffff;
        auVar234._24_4_ = 0x7fffffff;
        auVar234._28_4_ = 0x7fffffff;
        auVar125 = vandps_avx(ZEXT1632(auVar117),auVar234);
        auVar123 = vandps_avx(auVar126,auVar234);
        auVar123 = vmaxps_avx(auVar125,auVar123);
        auVar125 = vandps_avx(auVar134,auVar234);
        auVar125 = vmaxps_avx(auVar123,auVar125);
        auVar229._4_4_ = fVar188;
        auVar229._0_4_ = fVar188;
        auVar229._8_4_ = fVar188;
        auVar229._12_4_ = fVar188;
        auVar229._16_4_ = fVar188;
        auVar229._20_4_ = fVar188;
        auVar229._24_4_ = fVar188;
        auVar229._28_4_ = fVar188;
        uVar100 = vcmpps_avx512vl(auVar125,auVar229,1);
        bVar18 = (bool)((byte)uVar100 & 1);
        auVar137._0_4_ = (float)((uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar117._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar137._4_4_ = (float)((uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar117._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar137._8_4_ = (float)((uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar117._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar137._12_4_ = (float)((uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar117._12_4_);
        fVar170 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar122._16_4_);
        auVar137._16_4_ = fVar170;
        fVar188 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar122._20_4_);
        auVar137._20_4_ = fVar188;
        fVar184 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar122._24_4_);
        auVar137._24_4_ = fVar184;
        uVar101 = (uint)(byte)(uVar100 >> 7) * auVar122._28_4_;
        auVar137._28_4_ = uVar101;
        bVar18 = (bool)((byte)uVar100 & 1);
        auVar138._0_4_ = (float)((uint)bVar18 * auVar130._0_4_ | (uint)!bVar18 * auVar126._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar138._4_4_ = (float)((uint)bVar18 * auVar130._4_4_ | (uint)!bVar18 * auVar126._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar138._8_4_ = (float)((uint)bVar18 * auVar130._8_4_ | (uint)!bVar18 * auVar126._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar138._12_4_ = (float)((uint)bVar18 * auVar130._12_4_ | (uint)!bVar18 * auVar126._12_4_);
        bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar138._16_4_ = (float)((uint)bVar18 * auVar130._16_4_ | (uint)!bVar18 * auVar126._16_4_);
        bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar138._20_4_ = (float)((uint)bVar18 * auVar130._20_4_ | (uint)!bVar18 * auVar126._20_4_);
        bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar138._24_4_ = (float)((uint)bVar18 * auVar130._24_4_ | (uint)!bVar18 * auVar126._24_4_);
        bVar18 = SUB81(uVar100 >> 7,0);
        auVar138._28_4_ = (uint)bVar18 * auVar130._28_4_ | (uint)!bVar18 * auVar126._28_4_;
        auVar125 = vandps_avx(auVar234,ZEXT1632(auVar118));
        auVar123 = vandps_avx(auVar136,auVar234);
        auVar123 = vmaxps_avx(auVar125,auVar123);
        auVar125 = vandps_avx(auVar135,auVar234);
        auVar125 = vmaxps_avx(auVar123,auVar125);
        uVar100 = vcmpps_avx512vl(auVar125,auVar229,1);
        bVar18 = (bool)((byte)uVar100 & 1);
        auVar139._0_4_ = (float)((uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar118._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar139._4_4_ = (float)((uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar118._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar139._8_4_ = (float)((uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar118._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar139._12_4_ = (float)((uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar118._12_4_);
        fVar185 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar122._16_4_);
        auVar139._16_4_ = fVar185;
        fVar197 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar122._20_4_);
        auVar139._20_4_ = fVar197;
        fVar207 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar122._24_4_);
        auVar139._24_4_ = fVar207;
        auVar139._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar122._28_4_;
        bVar18 = (bool)((byte)uVar100 & 1);
        auVar140._0_4_ = (float)((uint)bVar18 * auVar130._0_4_ | (uint)!bVar18 * auVar136._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar140._4_4_ = (float)((uint)bVar18 * auVar130._4_4_ | (uint)!bVar18 * auVar136._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar140._8_4_ = (float)((uint)bVar18 * auVar130._8_4_ | (uint)!bVar18 * auVar136._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar140._12_4_ = (float)((uint)bVar18 * auVar130._12_4_ | (uint)!bVar18 * auVar136._12_4_);
        bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar140._16_4_ = (float)((uint)bVar18 * auVar130._16_4_ | (uint)!bVar18 * auVar136._16_4_);
        bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar140._20_4_ = (float)((uint)bVar18 * auVar130._20_4_ | (uint)!bVar18 * auVar136._20_4_);
        bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar140._24_4_ = (float)((uint)bVar18 * auVar130._24_4_ | (uint)!bVar18 * auVar136._24_4_);
        bVar18 = SUB81(uVar100 >> 7,0);
        auVar140._28_4_ = (uint)bVar18 * auVar130._28_4_ | (uint)!bVar18 * auVar136._28_4_;
        auVar119 = vxorps_avx512vl(auVar119,auVar119);
        auVar125 = vfmadd213ps_avx512vl(auVar137,auVar137,ZEXT1632(auVar119));
        auVar117 = vfmadd231ps_fma(auVar125,auVar138,auVar138);
        auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar117));
        fVar110 = auVar125._0_4_;
        fVar111 = auVar125._4_4_;
        fVar196 = auVar125._8_4_;
        fVar162 = auVar125._12_4_;
        fVar163 = auVar125._16_4_;
        fVar164 = auVar125._20_4_;
        fVar166 = auVar125._24_4_;
        auVar48._4_4_ = fVar111 * fVar111 * fVar111 * auVar117._4_4_ * -0.5;
        auVar48._0_4_ = fVar110 * fVar110 * fVar110 * auVar117._0_4_ * -0.5;
        auVar48._8_4_ = fVar196 * fVar196 * fVar196 * auVar117._8_4_ * -0.5;
        auVar48._12_4_ = fVar162 * fVar162 * fVar162 * auVar117._12_4_ * -0.5;
        auVar48._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
        auVar48._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
        auVar48._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar48._28_4_ = 0;
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar136 = vfmadd231ps_avx512vl(auVar48,auVar123,auVar125);
        auVar49._4_4_ = auVar138._4_4_ * auVar136._4_4_;
        auVar49._0_4_ = auVar138._0_4_ * auVar136._0_4_;
        auVar49._8_4_ = auVar138._8_4_ * auVar136._8_4_;
        auVar49._12_4_ = auVar138._12_4_ * auVar136._12_4_;
        auVar49._16_4_ = auVar138._16_4_ * auVar136._16_4_;
        auVar49._20_4_ = auVar138._20_4_ * auVar136._20_4_;
        auVar49._24_4_ = auVar138._24_4_ * auVar136._24_4_;
        auVar49._28_4_ = auVar125._28_4_;
        auVar50._4_4_ = auVar136._4_4_ * -auVar137._4_4_;
        auVar50._0_4_ = auVar136._0_4_ * -auVar137._0_4_;
        auVar50._8_4_ = auVar136._8_4_ * -auVar137._8_4_;
        auVar50._12_4_ = auVar136._12_4_ * -auVar137._12_4_;
        auVar50._16_4_ = auVar136._16_4_ * -fVar170;
        auVar50._20_4_ = auVar136._20_4_ * -fVar188;
        auVar50._24_4_ = auVar136._24_4_ * -fVar184;
        auVar50._28_4_ = uVar101 ^ 0x80000000;
        auVar125 = vmulps_avx512vl(auVar136,ZEXT1632(auVar119));
        auVar134 = ZEXT1632(auVar119);
        auVar135 = vfmadd213ps_avx512vl(auVar139,auVar139,auVar134);
        auVar117 = vfmadd231ps_fma(auVar135,auVar140,auVar140);
        auVar135 = vrsqrt14ps_avx512vl(ZEXT1632(auVar117));
        fVar188 = auVar135._0_4_;
        fVar170 = auVar135._4_4_;
        fVar184 = auVar135._8_4_;
        fVar110 = auVar135._12_4_;
        fVar111 = auVar135._16_4_;
        fVar196 = auVar135._20_4_;
        fVar162 = auVar135._24_4_;
        auVar51._4_4_ = fVar170 * fVar170 * fVar170 * auVar117._4_4_ * -0.5;
        auVar51._0_4_ = fVar188 * fVar188 * fVar188 * auVar117._0_4_ * -0.5;
        auVar51._8_4_ = fVar184 * fVar184 * fVar184 * auVar117._8_4_ * -0.5;
        auVar51._12_4_ = fVar110 * fVar110 * fVar110 * auVar117._12_4_ * -0.5;
        auVar51._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar51._20_4_ = fVar196 * fVar196 * fVar196 * -0.0;
        auVar51._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
        auVar51._28_4_ = 0;
        auVar123 = vfmadd231ps_avx512vl(auVar51,auVar123,auVar135);
        auVar52._4_4_ = auVar140._4_4_ * auVar123._4_4_;
        auVar52._0_4_ = auVar140._0_4_ * auVar123._0_4_;
        auVar52._8_4_ = auVar140._8_4_ * auVar123._8_4_;
        auVar52._12_4_ = auVar140._12_4_ * auVar123._12_4_;
        auVar52._16_4_ = auVar140._16_4_ * auVar123._16_4_;
        auVar52._20_4_ = auVar140._20_4_ * auVar123._20_4_;
        auVar52._24_4_ = auVar140._24_4_ * auVar123._24_4_;
        auVar52._28_4_ = auVar135._28_4_;
        auVar53._4_4_ = -auVar139._4_4_ * auVar123._4_4_;
        auVar53._0_4_ = -auVar139._0_4_ * auVar123._0_4_;
        auVar53._8_4_ = -auVar139._8_4_ * auVar123._8_4_;
        auVar53._12_4_ = -auVar139._12_4_ * auVar123._12_4_;
        auVar53._16_4_ = -fVar185 * auVar123._16_4_;
        auVar53._20_4_ = -fVar197 * auVar123._20_4_;
        auVar53._24_4_ = -fVar207 * auVar123._24_4_;
        auVar53._28_4_ = auVar136._28_4_;
        auVar123 = vmulps_avx512vl(auVar123,auVar134);
        auVar117 = vfmadd213ps_fma(auVar49,auVar120,auVar128);
        auVar118 = vfmadd213ps_fma(auVar50,auVar120,auVar129);
        auVar136 = vfmadd213ps_avx512vl(auVar125,auVar120,auVar127);
        auVar135 = vfmadd213ps_avx512vl(auVar52,auVar121,ZEXT1632(auVar174));
        auVar223 = vfnmadd213ps_fma(auVar49,auVar120,auVar128);
        auVar116 = vfmadd213ps_fma(auVar53,auVar121,ZEXT1632(auVar113));
        auVar198 = vfnmadd213ps_fma(auVar50,auVar120,auVar129);
        auVar115 = vfmadd213ps_fma(auVar123,auVar121,auVar124);
        auVar126 = vfnmadd231ps_avx512vl(auVar127,auVar120,auVar125);
        auVar39 = vfnmadd213ps_fma(auVar52,auVar121,ZEXT1632(auVar174));
        auVar113 = vfnmadd213ps_fma(auVar53,auVar121,ZEXT1632(auVar113));
        auVar114 = vfnmadd231ps_fma(auVar124,auVar121,auVar123);
        auVar123 = vsubps_avx512vl(auVar135,ZEXT1632(auVar223));
        auVar125 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar198));
        auVar124 = vsubps_avx512vl(ZEXT1632(auVar115),auVar126);
        auVar127 = vmulps_avx512vl(auVar125,auVar126);
        auVar174 = vfmsub231ps_fma(auVar127,ZEXT1632(auVar198),auVar124);
        auVar54._4_4_ = auVar223._4_4_ * auVar124._4_4_;
        auVar54._0_4_ = auVar223._0_4_ * auVar124._0_4_;
        auVar54._8_4_ = auVar223._8_4_ * auVar124._8_4_;
        auVar54._12_4_ = auVar223._12_4_ * auVar124._12_4_;
        auVar54._16_4_ = auVar124._16_4_ * 0.0;
        auVar54._20_4_ = auVar124._20_4_ * 0.0;
        auVar54._24_4_ = auVar124._24_4_ * 0.0;
        auVar54._28_4_ = auVar124._28_4_;
        auVar124 = vfmsub231ps_avx512vl(auVar54,auVar126,auVar123);
        auVar55._4_4_ = auVar198._4_4_ * auVar123._4_4_;
        auVar55._0_4_ = auVar198._0_4_ * auVar123._0_4_;
        auVar55._8_4_ = auVar198._8_4_ * auVar123._8_4_;
        auVar55._12_4_ = auVar198._12_4_ * auVar123._12_4_;
        auVar55._16_4_ = auVar123._16_4_ * 0.0;
        auVar55._20_4_ = auVar123._20_4_ * 0.0;
        auVar55._24_4_ = auVar123._24_4_ * 0.0;
        auVar55._28_4_ = auVar123._28_4_;
        auVar112 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar223),auVar125);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar112),auVar134,auVar124);
        auVar125 = vfmadd231ps_avx512vl(auVar125,auVar134,ZEXT1632(auVar174));
        auVar130 = ZEXT1632(auVar119);
        uVar100 = vcmpps_avx512vl(auVar125,auVar130,2);
        bVar99 = (byte)uVar100;
        fVar110 = (float)((uint)(bVar99 & 1) * auVar117._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar39._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        fVar196 = (float)((uint)bVar18 * auVar117._4_4_ | (uint)!bVar18 * auVar39._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        fVar163 = (float)((uint)bVar18 * auVar117._8_4_ | (uint)!bVar18 * auVar39._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        fVar166 = (float)((uint)bVar18 * auVar117._12_4_ | (uint)!bVar18 * auVar39._12_4_);
        auVar127 = ZEXT1632(CONCAT412(fVar166,CONCAT48(fVar163,CONCAT44(fVar196,fVar110))));
        fVar111 = (float)((uint)(bVar99 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar99 & 1) * auVar113._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        fVar162 = (float)((uint)bVar18 * auVar118._4_4_ | (uint)!bVar18 * auVar113._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        fVar164 = (float)((uint)bVar18 * auVar118._8_4_ | (uint)!bVar18 * auVar113._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        fVar167 = (float)((uint)bVar18 * auVar118._12_4_ | (uint)!bVar18 * auVar113._12_4_);
        auVar134 = ZEXT1632(CONCAT412(fVar167,CONCAT48(fVar164,CONCAT44(fVar162,fVar111))));
        auVar141._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar136._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar114._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar141._4_4_ = (float)((uint)bVar18 * auVar136._4_4_ | (uint)!bVar18 * auVar114._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar141._8_4_ = (float)((uint)bVar18 * auVar136._8_4_ | (uint)!bVar18 * auVar114._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar141._12_4_ = (float)((uint)bVar18 * auVar136._12_4_ | (uint)!bVar18 * auVar114._12_4_);
        fVar170 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar136._16_4_);
        auVar141._16_4_ = fVar170;
        fVar184 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar136._20_4_);
        auVar141._20_4_ = fVar184;
        fVar188 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar136._24_4_);
        auVar141._24_4_ = fVar188;
        iVar1 = (uint)(byte)(uVar100 >> 7) * auVar136._28_4_;
        auVar141._28_4_ = iVar1;
        auVar123 = vblendmps_avx512vl(ZEXT1632(auVar223),auVar135);
        auVar142._0_4_ =
             (uint)(bVar99 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar174._0_4_;
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar142._4_4_ = (uint)bVar18 * auVar123._4_4_ | (uint)!bVar18 * auVar174._4_4_;
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar142._8_4_ = (uint)bVar18 * auVar123._8_4_ | (uint)!bVar18 * auVar174._8_4_;
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar142._12_4_ = (uint)bVar18 * auVar123._12_4_ | (uint)!bVar18 * auVar174._12_4_;
        auVar142._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar123._16_4_;
        auVar142._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar123._20_4_;
        auVar142._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar123._24_4_;
        auVar142._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar123._28_4_;
        auVar123 = vblendmps_avx512vl(ZEXT1632(auVar198),ZEXT1632(auVar116));
        auVar143._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar118._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar143._4_4_ = (float)((uint)bVar18 * auVar123._4_4_ | (uint)!bVar18 * auVar118._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar143._8_4_ = (float)((uint)bVar18 * auVar123._8_4_ | (uint)!bVar18 * auVar118._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar143._12_4_ = (float)((uint)bVar18 * auVar123._12_4_ | (uint)!bVar18 * auVar118._12_4_);
        fVar207 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar123._16_4_);
        auVar143._16_4_ = fVar207;
        fVar197 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar123._20_4_);
        auVar143._20_4_ = fVar197;
        fVar185 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar123._24_4_);
        auVar143._24_4_ = fVar185;
        auVar143._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar123._28_4_;
        auVar123 = vblendmps_avx512vl(auVar126,ZEXT1632(auVar115));
        auVar144._0_4_ =
             (float)((uint)(bVar99 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar99 & 1) * auVar136._0_4_);
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar144._4_4_ = (float)((uint)bVar18 * auVar123._4_4_ | (uint)!bVar18 * auVar136._4_4_);
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar144._8_4_ = (float)((uint)bVar18 * auVar123._8_4_ | (uint)!bVar18 * auVar136._8_4_);
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar144._12_4_ = (float)((uint)bVar18 * auVar123._12_4_ | (uint)!bVar18 * auVar136._12_4_);
        bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
        auVar144._16_4_ = (float)((uint)bVar18 * auVar123._16_4_ | (uint)!bVar18 * auVar136._16_4_);
        bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
        auVar144._20_4_ = (float)((uint)bVar18 * auVar123._20_4_ | (uint)!bVar18 * auVar136._20_4_);
        bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
        auVar144._24_4_ = (float)((uint)bVar18 * auVar123._24_4_ | (uint)!bVar18 * auVar136._24_4_);
        bVar18 = SUB81(uVar100 >> 7,0);
        auVar144._28_4_ = (uint)bVar18 * auVar123._28_4_ | (uint)!bVar18 * auVar136._28_4_;
        auVar145._0_4_ =
             (uint)(bVar99 & 1) * (int)auVar223._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar135._0_4_;
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar145._4_4_ = (uint)bVar18 * (int)auVar223._4_4_ | (uint)!bVar18 * auVar135._4_4_;
        bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar145._8_4_ = (uint)bVar18 * (int)auVar223._8_4_ | (uint)!bVar18 * auVar135._8_4_;
        bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar145._12_4_ = (uint)bVar18 * (int)auVar223._12_4_ | (uint)!bVar18 * auVar135._12_4_;
        auVar145._16_4_ = (uint)!(bool)((byte)(uVar100 >> 4) & 1) * auVar135._16_4_;
        auVar145._20_4_ = (uint)!(bool)((byte)(uVar100 >> 5) & 1) * auVar135._20_4_;
        auVar145._24_4_ = (uint)!(bool)((byte)(uVar100 >> 6) & 1) * auVar135._24_4_;
        auVar145._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar135._28_4_;
        bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
        bVar20 = (bool)((byte)(uVar100 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar146._0_4_ =
             (uint)(bVar99 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar115._0_4_;
        bVar19 = (bool)((byte)(uVar100 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar19 * auVar126._4_4_ | (uint)!bVar19 * auVar115._4_4_;
        bVar19 = (bool)((byte)(uVar100 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar19 * auVar126._8_4_ | (uint)!bVar19 * auVar115._8_4_;
        bVar19 = (bool)((byte)(uVar100 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar19 * auVar126._12_4_ | (uint)!bVar19 * auVar115._12_4_;
        auVar146._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar126._16_4_;
        auVar146._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar126._20_4_;
        auVar146._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar126._24_4_;
        iVar2 = (uint)(byte)(uVar100 >> 7) * auVar126._28_4_;
        auVar146._28_4_ = iVar2;
        auVar128 = vsubps_avx512vl(auVar145,auVar127);
        auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar198._12_4_ |
                                                 (uint)!bVar21 * auVar116._12_4_,
                                                 CONCAT48((uint)bVar20 * (int)auVar198._8_4_ |
                                                          (uint)!bVar20 * auVar116._8_4_,
                                                          CONCAT44((uint)bVar18 *
                                                                   (int)auVar198._4_4_ |
                                                                   (uint)!bVar18 * auVar116._4_4_,
                                                                   (uint)(bVar99 & 1) *
                                                                   (int)auVar198._0_4_ |
                                                                   (uint)!(bool)(bVar99 & 1) *
                                                                   auVar116._0_4_)))),auVar134);
        auVar218 = ZEXT3264(auVar123);
        auVar136 = vsubps_avx(auVar146,auVar141);
        auVar135 = vsubps_avx(auVar127,auVar142);
        auVar222 = ZEXT3264(auVar135);
        auVar126 = vsubps_avx(auVar134,auVar143);
        auVar124 = vsubps_avx(auVar141,auVar144);
        auVar56._4_4_ = auVar136._4_4_ * fVar196;
        auVar56._0_4_ = auVar136._0_4_ * fVar110;
        auVar56._8_4_ = auVar136._8_4_ * fVar163;
        auVar56._12_4_ = auVar136._12_4_ * fVar166;
        auVar56._16_4_ = auVar136._16_4_ * 0.0;
        auVar56._20_4_ = auVar136._20_4_ * 0.0;
        auVar56._24_4_ = auVar136._24_4_ * 0.0;
        auVar56._28_4_ = iVar2;
        auVar117 = vfmsub231ps_fma(auVar56,auVar141,auVar128);
        auVar57._4_4_ = fVar162 * auVar128._4_4_;
        auVar57._0_4_ = fVar111 * auVar128._0_4_;
        auVar57._8_4_ = fVar164 * auVar128._8_4_;
        auVar57._12_4_ = fVar167 * auVar128._12_4_;
        auVar57._16_4_ = auVar128._16_4_ * 0.0;
        auVar57._20_4_ = auVar128._20_4_ * 0.0;
        auVar57._24_4_ = auVar128._24_4_ * 0.0;
        auVar57._28_4_ = auVar125._28_4_;
        auVar118 = vfmsub231ps_fma(auVar57,auVar127,auVar123);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar130,ZEXT1632(auVar117));
        auVar209._0_4_ = auVar123._0_4_ * auVar141._0_4_;
        auVar209._4_4_ = auVar123._4_4_ * auVar141._4_4_;
        auVar209._8_4_ = auVar123._8_4_ * auVar141._8_4_;
        auVar209._12_4_ = auVar123._12_4_ * auVar141._12_4_;
        auVar209._16_4_ = auVar123._16_4_ * fVar170;
        auVar209._20_4_ = auVar123._20_4_ * fVar184;
        auVar209._24_4_ = auVar123._24_4_ * fVar188;
        auVar209._28_4_ = 0;
        auVar117 = vfmsub231ps_fma(auVar209,auVar134,auVar136);
        auVar129 = vfmadd231ps_avx512vl(auVar125,auVar130,ZEXT1632(auVar117));
        auVar125 = vmulps_avx512vl(auVar124,auVar142);
        auVar125 = vfmsub231ps_avx512vl(auVar125,auVar135,auVar144);
        auVar58._4_4_ = auVar126._4_4_ * auVar144._4_4_;
        auVar58._0_4_ = auVar126._0_4_ * auVar144._0_4_;
        auVar58._8_4_ = auVar126._8_4_ * auVar144._8_4_;
        auVar58._12_4_ = auVar126._12_4_ * auVar144._12_4_;
        auVar58._16_4_ = auVar126._16_4_ * auVar144._16_4_;
        auVar58._20_4_ = auVar126._20_4_ * auVar144._20_4_;
        auVar58._24_4_ = auVar126._24_4_ * auVar144._24_4_;
        auVar58._28_4_ = auVar144._28_4_;
        auVar117 = vfmsub231ps_fma(auVar58,auVar143,auVar124);
        auVar210._0_4_ = auVar143._0_4_ * auVar135._0_4_;
        auVar210._4_4_ = auVar143._4_4_ * auVar135._4_4_;
        auVar210._8_4_ = auVar143._8_4_ * auVar135._8_4_;
        auVar210._12_4_ = auVar143._12_4_ * auVar135._12_4_;
        auVar210._16_4_ = fVar207 * auVar135._16_4_;
        auVar210._20_4_ = fVar197 * auVar135._20_4_;
        auVar210._24_4_ = fVar185 * auVar135._24_4_;
        auVar210._28_4_ = 0;
        auVar118 = vfmsub231ps_fma(auVar210,auVar126,auVar142);
        auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar130,auVar125);
        auVar122 = vfmadd231ps_avx512vl(auVar125,auVar130,ZEXT1632(auVar117));
        auVar213 = ZEXT3264(auVar122);
        auVar125 = vmaxps_avx(auVar129,auVar122);
        uVar34 = vcmpps_avx512vl(auVar125,auVar130,2);
        bVar109 = bVar109 & (byte)uVar34;
        if (bVar109 != 0) {
          uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar235._4_4_ = uVar171;
          auVar235._0_4_ = uVar171;
          auVar235._8_4_ = uVar171;
          auVar235._12_4_ = uVar171;
          auVar235._16_4_ = uVar171;
          auVar235._20_4_ = uVar171;
          auVar235._24_4_ = uVar171;
          auVar235._28_4_ = uVar171;
          auVar238 = ZEXT3264(auVar235);
          auVar59._4_4_ = auVar124._4_4_ * auVar123._4_4_;
          auVar59._0_4_ = auVar124._0_4_ * auVar123._0_4_;
          auVar59._8_4_ = auVar124._8_4_ * auVar123._8_4_;
          auVar59._12_4_ = auVar124._12_4_ * auVar123._12_4_;
          auVar59._16_4_ = auVar124._16_4_ * auVar123._16_4_;
          auVar59._20_4_ = auVar124._20_4_ * auVar123._20_4_;
          auVar59._24_4_ = auVar124._24_4_ * auVar123._24_4_;
          auVar59._28_4_ = auVar125._28_4_;
          auVar174 = vfmsub231ps_fma(auVar59,auVar126,auVar136);
          auVar60._4_4_ = auVar136._4_4_ * auVar135._4_4_;
          auVar60._0_4_ = auVar136._0_4_ * auVar135._0_4_;
          auVar60._8_4_ = auVar136._8_4_ * auVar135._8_4_;
          auVar60._12_4_ = auVar136._12_4_ * auVar135._12_4_;
          auVar60._16_4_ = auVar136._16_4_ * auVar135._16_4_;
          auVar60._20_4_ = auVar136._20_4_ * auVar135._20_4_;
          auVar60._24_4_ = auVar136._24_4_ * auVar135._24_4_;
          auVar60._28_4_ = auVar136._28_4_;
          auVar116 = vfmsub231ps_fma(auVar60,auVar128,auVar124);
          auVar61._4_4_ = auVar126._4_4_ * auVar128._4_4_;
          auVar61._0_4_ = auVar126._0_4_ * auVar128._0_4_;
          auVar61._8_4_ = auVar126._8_4_ * auVar128._8_4_;
          auVar61._12_4_ = auVar126._12_4_ * auVar128._12_4_;
          auVar61._16_4_ = auVar126._16_4_ * auVar128._16_4_;
          auVar61._20_4_ = auVar126._20_4_ * auVar128._20_4_;
          auVar61._24_4_ = auVar126._24_4_ * auVar128._24_4_;
          auVar61._28_4_ = auVar126._28_4_;
          auVar115 = vfmsub231ps_fma(auVar61,auVar135,auVar123);
          auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar116),ZEXT1632(auVar115));
          auVar118 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT1632(auVar174),
                                     ZEXT1232(ZEXT412(0)) << 0x20);
          auVar125 = vrcp14ps_avx512vl(ZEXT1632(auVar118));
          auVar222 = ZEXT3264(auVar125);
          auVar40._8_4_ = 0x3f800000;
          auVar40._0_8_ = 0x3f8000003f800000;
          auVar40._12_4_ = 0x3f800000;
          auVar40._16_4_ = 0x3f800000;
          auVar40._20_4_ = 0x3f800000;
          auVar40._24_4_ = 0x3f800000;
          auVar40._28_4_ = 0x3f800000;
          auVar123 = vfnmadd213ps_avx512vl(auVar125,ZEXT1632(auVar118),auVar40);
          auVar117 = vfmadd132ps_fma(auVar123,auVar125,auVar125);
          auVar218 = ZEXT1664(auVar117);
          auVar62._4_4_ = auVar115._4_4_ * auVar141._4_4_;
          auVar62._0_4_ = auVar115._0_4_ * auVar141._0_4_;
          auVar62._8_4_ = auVar115._8_4_ * auVar141._8_4_;
          auVar62._12_4_ = auVar115._12_4_ * auVar141._12_4_;
          auVar62._16_4_ = fVar170 * 0.0;
          auVar62._20_4_ = fVar184 * 0.0;
          auVar62._24_4_ = fVar188 * 0.0;
          auVar62._28_4_ = iVar1;
          auVar116 = vfmadd231ps_fma(auVar62,auVar134,ZEXT1632(auVar116));
          auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar127,ZEXT1632(auVar174));
          fVar188 = auVar117._0_4_;
          fVar170 = auVar117._4_4_;
          fVar184 = auVar117._8_4_;
          fVar185 = auVar117._12_4_;
          local_580 = ZEXT1632(CONCAT412(auVar116._12_4_ * fVar185,
                                         CONCAT48(auVar116._8_4_ * fVar184,
                                                  CONCAT44(auVar116._4_4_ * fVar170,
                                                           auVar116._0_4_ * fVar188))));
          auVar224 = ZEXT3264(local_580);
          auVar175._4_4_ = local_720;
          auVar175._0_4_ = local_720;
          auVar175._8_4_ = local_720;
          auVar175._12_4_ = local_720;
          auVar175._16_4_ = local_720;
          auVar175._20_4_ = local_720;
          auVar175._24_4_ = local_720;
          auVar175._28_4_ = local_720;
          uVar34 = vcmpps_avx512vl(local_580,auVar235,2);
          uVar35 = vcmpps_avx512vl(auVar175,local_580,2);
          bVar109 = (byte)uVar34 & (byte)uVar35 & bVar109;
          if (bVar109 != 0) {
            uVar104 = vcmpps_avx512vl(ZEXT1632(auVar118),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar104 = bVar109 & uVar104;
            if ((char)uVar104 != '\0') {
              fVar197 = auVar129._0_4_ * fVar188;
              fVar207 = auVar129._4_4_ * fVar170;
              auVar63._4_4_ = fVar207;
              auVar63._0_4_ = fVar197;
              fVar110 = auVar129._8_4_ * fVar184;
              auVar63._8_4_ = fVar110;
              fVar111 = auVar129._12_4_ * fVar185;
              auVar63._12_4_ = fVar111;
              fVar196 = auVar129._16_4_ * 0.0;
              auVar63._16_4_ = fVar196;
              fVar162 = auVar129._20_4_ * 0.0;
              auVar63._20_4_ = fVar162;
              fVar163 = auVar129._24_4_ * 0.0;
              auVar63._24_4_ = fVar163;
              auVar63._28_4_ = auVar129._28_4_;
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar125 = vsubps_avx(auVar176,auVar63);
              local_5c0._0_4_ =
                   (float)((uint)(bVar99 & 1) * (int)fVar197 |
                          (uint)!(bool)(bVar99 & 1) * auVar125._0_4_);
              bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
              local_5c0._4_4_ =
                   (float)((uint)bVar18 * (int)fVar207 | (uint)!bVar18 * auVar125._4_4_);
              bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
              local_5c0._8_4_ =
                   (float)((uint)bVar18 * (int)fVar110 | (uint)!bVar18 * auVar125._8_4_);
              bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
              local_5c0._12_4_ =
                   (float)((uint)bVar18 * (int)fVar111 | (uint)!bVar18 * auVar125._12_4_);
              bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
              local_5c0._16_4_ =
                   (float)((uint)bVar18 * (int)fVar196 | (uint)!bVar18 * auVar125._16_4_);
              bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
              local_5c0._20_4_ =
                   (float)((uint)bVar18 * (int)fVar162 | (uint)!bVar18 * auVar125._20_4_);
              bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
              local_5c0._24_4_ =
                   (float)((uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar125._24_4_);
              bVar18 = SUB81(uVar100 >> 7,0);
              local_5c0._28_4_ =
                   (float)((uint)bVar18 * auVar129._28_4_ | (uint)!bVar18 * auVar125._28_4_);
              auVar125 = vsubps_avx(auVar121,auVar120);
              auVar117 = vfmadd213ps_fma(auVar125,local_5c0,auVar120);
              uVar171 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar41._4_4_ = uVar171;
              auVar41._0_4_ = uVar171;
              auVar41._8_4_ = uVar171;
              auVar41._12_4_ = uVar171;
              auVar41._16_4_ = uVar171;
              auVar41._20_4_ = uVar171;
              auVar41._24_4_ = uVar171;
              auVar41._28_4_ = uVar171;
              auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar117._12_4_ + auVar117._12_4_,
                                                            CONCAT48(auVar117._8_4_ + auVar117._8_4_
                                                                     ,CONCAT44(auVar117._4_4_ +
                                                                               auVar117._4_4_,
                                                                               auVar117._0_4_ +
                                                                               auVar117._0_4_)))),
                                         auVar41);
              uVar36 = vcmpps_avx512vl(local_580,auVar125,6);
              uVar104 = uVar104 & uVar36;
              bVar109 = (byte)uVar104;
              if (bVar109 != 0) {
                auVar194._0_4_ = auVar122._0_4_ * fVar188;
                auVar194._4_4_ = auVar122._4_4_ * fVar170;
                auVar194._8_4_ = auVar122._8_4_ * fVar184;
                auVar194._12_4_ = auVar122._12_4_ * fVar185;
                auVar194._16_4_ = auVar122._16_4_ * 0.0;
                auVar194._20_4_ = auVar122._20_4_ * 0.0;
                auVar194._24_4_ = auVar122._24_4_ * 0.0;
                auVar194._28_4_ = 0;
                auVar204._8_4_ = 0x3f800000;
                auVar204._0_8_ = 0x3f8000003f800000;
                auVar204._12_4_ = 0x3f800000;
                auVar204._16_4_ = 0x3f800000;
                auVar204._20_4_ = 0x3f800000;
                auVar204._24_4_ = 0x3f800000;
                auVar204._28_4_ = 0x3f800000;
                auVar125 = vsubps_avx(auVar204,auVar194);
                auVar147._0_4_ =
                     (uint)(bVar99 & 1) * (int)auVar194._0_4_ |
                     (uint)!(bool)(bVar99 & 1) * auVar125._0_4_;
                bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
                auVar147._4_4_ = (uint)bVar18 * (int)auVar194._4_4_ | (uint)!bVar18 * auVar125._4_4_
                ;
                bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
                auVar147._8_4_ = (uint)bVar18 * (int)auVar194._8_4_ | (uint)!bVar18 * auVar125._8_4_
                ;
                bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
                auVar147._12_4_ =
                     (uint)bVar18 * (int)auVar194._12_4_ | (uint)!bVar18 * auVar125._12_4_;
                bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
                auVar147._16_4_ =
                     (uint)bVar18 * (int)auVar194._16_4_ | (uint)!bVar18 * auVar125._16_4_;
                bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
                auVar147._20_4_ =
                     (uint)bVar18 * (int)auVar194._20_4_ | (uint)!bVar18 * auVar125._20_4_;
                bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
                auVar147._24_4_ =
                     (uint)bVar18 * (int)auVar194._24_4_ | (uint)!bVar18 * auVar125._24_4_;
                auVar147._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar125._28_4_;
                auVar42._8_4_ = 0x40000000;
                auVar42._0_8_ = 0x4000000040000000;
                auVar42._12_4_ = 0x40000000;
                auVar42._16_4_ = 0x40000000;
                auVar42._20_4_ = 0x40000000;
                auVar42._24_4_ = 0x40000000;
                auVar42._28_4_ = 0x40000000;
                local_5a0 = vfmsub132ps_avx512vl(auVar147,auVar204,auVar42);
                local_560 = 0;
                auVar222 = ZEXT1664(auVar32);
                if ((pGVar108->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar188 = 1.0 / auVar230._0_4_;
                  local_500[0] = fVar188 * (local_5c0._0_4_ + 0.0);
                  local_500[1] = fVar188 * (local_5c0._4_4_ + 1.0);
                  local_500[2] = fVar188 * (local_5c0._8_4_ + 2.0);
                  local_500[3] = fVar188 * (local_5c0._12_4_ + 3.0);
                  fStack_4f0 = fVar188 * (local_5c0._16_4_ + 4.0);
                  fStack_4ec = fVar188 * (local_5c0._20_4_ + 5.0);
                  fStack_4e8 = fVar188 * (local_5c0._24_4_ + 6.0);
                  fStack_4e4 = local_5c0._28_4_ + 7.0;
                  local_4e0 = local_5a0;
                  local_4c0 = local_580;
                  auVar177._8_4_ = 0x7f800000;
                  auVar177._0_8_ = 0x7f8000007f800000;
                  auVar177._12_4_ = 0x7f800000;
                  auVar177._16_4_ = 0x7f800000;
                  auVar177._20_4_ = 0x7f800000;
                  auVar177._24_4_ = 0x7f800000;
                  auVar177._28_4_ = 0x7f800000;
                  auVar125 = vblendmps_avx512vl(auVar177,local_580);
                  auVar148._0_4_ =
                       (uint)(bVar109 & 1) * auVar125._0_4_ |
                       (uint)!(bool)(bVar109 & 1) * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar104 >> 1) & 1);
                  auVar148._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar104 >> 2) & 1);
                  auVar148._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar104 >> 3) & 1);
                  auVar148._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                  auVar148._16_4_ = (uint)bVar18 * auVar125._16_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                  auVar148._20_4_ = (uint)bVar18 * auVar125._20_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = (bool)((byte)(uVar104 >> 6) & 1);
                  auVar148._24_4_ = (uint)bVar18 * auVar125._24_4_ | (uint)!bVar18 * 0x7f800000;
                  bVar18 = SUB81(uVar104 >> 7,0);
                  auVar148._28_4_ = (uint)bVar18 * auVar125._28_4_ | (uint)!bVar18 * 0x7f800000;
                  auVar125 = vshufps_avx(auVar148,auVar148,0xb1);
                  auVar125 = vminps_avx(auVar148,auVar125);
                  auVar123 = vshufpd_avx(auVar125,auVar125,5);
                  auVar125 = vminps_avx(auVar125,auVar123);
                  auVar123 = vpermpd_avx2(auVar125,0x4e);
                  auVar125 = vminps_avx(auVar125,auVar123);
                  uVar34 = vcmpps_avx512vl(auVar148,auVar125,0);
                  uVar101 = (uint)uVar104;
                  if (((byte)uVar34 & bVar109) != 0) {
                    uVar101 = (uint)((byte)uVar34 & bVar109);
                  }
                  uVar102 = 0;
                  for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
                    uVar102 = uVar102 + 1;
                  }
                  uVar100 = (ulong)uVar102;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar108->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar213 = vpbroadcastd_avx512f();
                    local_400 = vmovdqa64_avx512f(auVar213);
                    auVar213 = vpbroadcastd_avx512f();
                    local_480 = vmovdqa64_avx512f(auVar213);
                    local_800 = auVar131;
                    local_7c0 = local_580;
                    local_7a0 = pGVar108;
                    local_55c = iVar103;
                    local_550 = auVar32;
                    local_540 = uVar33;
                    uStack_538 = uVar37;
                    local_530 = uVar94;
                    uStack_528 = uVar95;
                    local_520 = uVar96;
                    uStack_518 = uVar97;
                    do {
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_500[uVar100]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_4e0 + uVar100 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_4c0 + uVar100 * 4);
                      local_840.context = context->user;
                      fVar185 = local_200._0_4_;
                      fVar170 = 1.0 - fVar185;
                      fVar188 = fVar170 * fVar170 * -3.0;
                      auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),
                                                 ZEXT416((uint)(fVar185 * fVar170)),
                                                 ZEXT416(0xc0000000));
                      auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar170)),
                                                 ZEXT416((uint)(fVar185 * fVar185)),
                                                 ZEXT416(0x40000000));
                      fVar170 = auVar117._0_4_ * 3.0;
                      fVar184 = auVar118._0_4_ * 3.0;
                      fVar185 = fVar185 * fVar185 * 3.0;
                      auVar217._0_4_ = fVar185 * local_880;
                      auVar217._4_4_ = fVar185 * fStack_87c;
                      auVar217._8_4_ = fVar185 * fStack_878;
                      auVar217._12_4_ = fVar185 * fStack_874;
                      auVar116._4_4_ = fVar184;
                      auVar116._0_4_ = fVar184;
                      auVar116._8_4_ = fVar184;
                      auVar116._12_4_ = fVar184;
                      auVar117 = vfmadd132ps_fma(auVar116,auVar217,auVar8);
                      auVar115._4_4_ = fVar170;
                      auVar115._0_4_ = fVar170;
                      auVar115._8_4_ = fVar170;
                      auVar115._12_4_ = fVar170;
                      auVar117 = vfmadd132ps_fma(auVar115,auVar117,auVar9);
                      auVar174._4_4_ = fVar188;
                      auVar174._0_4_ = fVar188;
                      auVar174._8_4_ = fVar188;
                      auVar174._12_4_ = fVar188;
                      auVar117 = vfmadd213ps_fma(auVar174,auVar32,auVar117);
                      auVar222 = vbroadcastss_avx512f(auVar117);
                      auVar213 = vbroadcastss_avx512f(ZEXT416(1));
                      auVar213 = vpermps_avx512f(auVar213,ZEXT1664(auVar117));
                      auVar218 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar218,ZEXT1664(auVar117));
                      local_2c0[0] = (RTCHitN)auVar222[0];
                      local_2c0[1] = (RTCHitN)auVar222[1];
                      local_2c0[2] = (RTCHitN)auVar222[2];
                      local_2c0[3] = (RTCHitN)auVar222[3];
                      local_2c0[4] = (RTCHitN)auVar222[4];
                      local_2c0[5] = (RTCHitN)auVar222[5];
                      local_2c0[6] = (RTCHitN)auVar222[6];
                      local_2c0[7] = (RTCHitN)auVar222[7];
                      local_2c0[8] = (RTCHitN)auVar222[8];
                      local_2c0[9] = (RTCHitN)auVar222[9];
                      local_2c0[10] = (RTCHitN)auVar222[10];
                      local_2c0[0xb] = (RTCHitN)auVar222[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar222[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar222[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar222[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar222[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar222[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar222[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar222[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar222[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar222[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar222[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar222[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar222[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar222[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar222[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar222[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar222[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar222[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar222[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar222[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar222[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar222[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar222[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar222[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar222[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar222[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar222[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar222[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar222[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar222[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar222[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar222[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar222[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar222[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar222[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar222[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar222[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar222[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar222[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar222[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar222[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar222[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar222[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar222[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar222[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar222[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar222[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar222[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar222[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar222[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar222[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar222[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar222[0x3f];
                      local_280 = auVar213;
                      local_180 = local_480._0_8_;
                      uStack_178 = local_480._8_8_;
                      uStack_170 = local_480._16_8_;
                      uStack_168 = local_480._24_8_;
                      uStack_160 = local_480._32_8_;
                      uStack_158 = local_480._40_8_;
                      uStack_150 = local_480._48_8_;
                      uStack_148 = local_480._56_8_;
                      auVar222 = vmovdqa64_avx512f(local_400);
                      local_140 = vmovdqa64_avx512f(auVar222);
                      auVar125 = vpcmpeqd_avx2(auVar222._0_32_,auVar222._0_32_);
                      local_810[3] = auVar125;
                      local_810[2] = auVar125;
                      local_810[1] = auVar125;
                      *local_810 = auVar125;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]));
                      auVar222 = vmovdqa64_avx512f(local_300);
                      local_700 = vmovdqa64_avx512f(auVar222);
                      local_840.valid = (int *)local_700;
                      local_840.geometryUserPtr = pGVar108->userPtr;
                      local_840.hit = local_2c0;
                      local_840.N = 0x10;
                      local_740 = auVar238._0_32_;
                      local_840.ray = (RTCRayN *)ray;
                      if (pGVar108->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar213 = ZEXT1664(auVar213._0_16_);
                        auVar218 = ZEXT1664(auVar218._0_16_);
                        (*pGVar108->intersectionFilterN)(&local_840);
                        auVar224 = ZEXT3264(local_7c0);
                        auVar238 = ZEXT3264(local_740);
                        auVar239 = ZEXT3264(local_800);
                        auVar240 = ZEXT3264(local_780);
                        auVar183 = ZEXT3264(local_760);
                        auVar222 = vmovdqa64_avx512f(local_700);
                        pGVar108 = local_7a0;
                      }
                      uVar34 = vptestmd_avx512f(auVar222,auVar222);
                      if ((short)uVar34 == 0) {
LAB_01d632c3:
                        *(int *)(ray + k * 4 + 0x200) = auVar238._0_4_;
                      }
                      else {
                        p_Var17 = context->args->filter;
                        if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar108->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          (*p_Var17)(&local_840);
                          auVar224 = ZEXT3264(local_7c0);
                          auVar238 = ZEXT3264(local_740);
                          auVar239 = ZEXT3264(local_800);
                          auVar240 = ZEXT3264(local_780);
                          auVar183 = ZEXT3264(local_760);
                          auVar222 = vmovdqa64_avx512f(local_700);
                          pGVar108 = local_7a0;
                        }
                        uVar36 = vptestmd_avx512f(auVar222,auVar222);
                        if ((short)uVar36 == 0) goto LAB_01d632c3;
                        iVar1 = *(int *)(local_840.hit + 4);
                        iVar2 = *(int *)(local_840.hit + 8);
                        iVar81 = *(int *)(local_840.hit + 0xc);
                        iVar82 = *(int *)(local_840.hit + 0x10);
                        iVar83 = *(int *)(local_840.hit + 0x14);
                        iVar84 = *(int *)(local_840.hit + 0x18);
                        iVar85 = *(int *)(local_840.hit + 0x1c);
                        iVar86 = *(int *)(local_840.hit + 0x20);
                        iVar87 = *(int *)(local_840.hit + 0x24);
                        iVar88 = *(int *)(local_840.hit + 0x28);
                        iVar89 = *(int *)(local_840.hit + 0x2c);
                        iVar90 = *(int *)(local_840.hit + 0x30);
                        iVar91 = *(int *)(local_840.hit + 0x34);
                        iVar92 = *(int *)(local_840.hit + 0x38);
                        iVar93 = *(int *)(local_840.hit + 0x3c);
                        bVar109 = (byte)uVar36;
                        bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar99 = (byte)(uVar36 >> 8);
                        bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar31 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x300) =
                             (uint)(bVar109 & 1) * *(int *)local_840.hit |
                             (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x300);
                        *(uint *)(local_840.ray + 0x304) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x304);
                        *(uint *)(local_840.ray + 0x308) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x308);
                        *(uint *)(local_840.ray + 0x30c) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x30c)
                        ;
                        *(uint *)(local_840.ray + 0x310) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x310)
                        ;
                        *(uint *)(local_840.ray + 0x314) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x314)
                        ;
                        *(uint *)(local_840.ray + 0x318) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x318)
                        ;
                        *(uint *)(local_840.ray + 0x31c) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_840.ray + 0x31c)
                        ;
                        *(uint *)(local_840.ray + 800) =
                             (uint)(bVar99 & 1) * iVar86 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 800);
                        *(uint *)(local_840.ray + 0x324) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x324)
                        ;
                        *(uint *)(local_840.ray + 0x328) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x328)
                        ;
                        *(uint *)(local_840.ray + 0x32c) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x32c)
                        ;
                        *(uint *)(local_840.ray + 0x330) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x330)
                        ;
                        *(uint *)(local_840.ray + 0x334) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x334)
                        ;
                        *(uint *)(local_840.ray + 0x338) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x338)
                        ;
                        *(uint *)(local_840.ray + 0x33c) =
                             (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_840.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0x44);
                        iVar2 = *(int *)(local_840.hit + 0x48);
                        iVar81 = *(int *)(local_840.hit + 0x4c);
                        iVar82 = *(int *)(local_840.hit + 0x50);
                        iVar83 = *(int *)(local_840.hit + 0x54);
                        iVar84 = *(int *)(local_840.hit + 0x58);
                        iVar85 = *(int *)(local_840.hit + 0x5c);
                        iVar86 = *(int *)(local_840.hit + 0x60);
                        iVar87 = *(int *)(local_840.hit + 100);
                        iVar88 = *(int *)(local_840.hit + 0x68);
                        iVar89 = *(int *)(local_840.hit + 0x6c);
                        iVar90 = *(int *)(local_840.hit + 0x70);
                        iVar91 = *(int *)(local_840.hit + 0x74);
                        iVar92 = *(int *)(local_840.hit + 0x78);
                        iVar93 = *(int *)(local_840.hit + 0x7c);
                        bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar31 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x340) =
                             (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0x40) |
                             (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x340);
                        *(uint *)(local_840.ray + 0x344) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x344);
                        *(uint *)(local_840.ray + 0x348) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x348);
                        *(uint *)(local_840.ray + 0x34c) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x34c)
                        ;
                        *(uint *)(local_840.ray + 0x350) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x350)
                        ;
                        *(uint *)(local_840.ray + 0x354) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x354)
                        ;
                        *(uint *)(local_840.ray + 0x358) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x358)
                        ;
                        *(uint *)(local_840.ray + 0x35c) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_840.ray + 0x35c)
                        ;
                        *(uint *)(local_840.ray + 0x360) =
                             (uint)(bVar99 & 1) * iVar86 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x360);
                        *(uint *)(local_840.ray + 0x364) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x364)
                        ;
                        *(uint *)(local_840.ray + 0x368) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x368)
                        ;
                        *(uint *)(local_840.ray + 0x36c) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x36c)
                        ;
                        *(uint *)(local_840.ray + 0x370) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x370)
                        ;
                        *(uint *)(local_840.ray + 0x374) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x374)
                        ;
                        *(uint *)(local_840.ray + 0x378) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x378)
                        ;
                        *(uint *)(local_840.ray + 0x37c) =
                             (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_840.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0x84);
                        iVar2 = *(int *)(local_840.hit + 0x88);
                        iVar81 = *(int *)(local_840.hit + 0x8c);
                        iVar82 = *(int *)(local_840.hit + 0x90);
                        iVar83 = *(int *)(local_840.hit + 0x94);
                        iVar84 = *(int *)(local_840.hit + 0x98);
                        iVar85 = *(int *)(local_840.hit + 0x9c);
                        iVar86 = *(int *)(local_840.hit + 0xa0);
                        iVar87 = *(int *)(local_840.hit + 0xa4);
                        iVar88 = *(int *)(local_840.hit + 0xa8);
                        iVar89 = *(int *)(local_840.hit + 0xac);
                        iVar90 = *(int *)(local_840.hit + 0xb0);
                        iVar91 = *(int *)(local_840.hit + 0xb4);
                        iVar92 = *(int *)(local_840.hit + 0xb8);
                        iVar93 = *(int *)(local_840.hit + 0xbc);
                        bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar31 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x380) =
                             (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0x80) |
                             (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x380);
                        *(uint *)(local_840.ray + 900) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 900);
                        *(uint *)(local_840.ray + 0x388) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x388);
                        *(uint *)(local_840.ray + 0x38c) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x38c)
                        ;
                        *(uint *)(local_840.ray + 0x390) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x390)
                        ;
                        *(uint *)(local_840.ray + 0x394) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x394)
                        ;
                        *(uint *)(local_840.ray + 0x398) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x398)
                        ;
                        *(uint *)(local_840.ray + 0x39c) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_840.ray + 0x39c)
                        ;
                        *(uint *)(local_840.ray + 0x3a0) =
                             (uint)(bVar99 & 1) * iVar86 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x3a0);
                        *(uint *)(local_840.ray + 0x3a4) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3a4)
                        ;
                        *(uint *)(local_840.ray + 0x3a8) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x3a8)
                        ;
                        *(uint *)(local_840.ray + 0x3ac) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x3ac)
                        ;
                        *(uint *)(local_840.ray + 0x3b0) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x3b0)
                        ;
                        *(uint *)(local_840.ray + 0x3b4) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x3b4)
                        ;
                        *(uint *)(local_840.ray + 0x3b8) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x3b8)
                        ;
                        *(uint *)(local_840.ray + 0x3bc) =
                             (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_840.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0xc4);
                        iVar2 = *(int *)(local_840.hit + 200);
                        iVar81 = *(int *)(local_840.hit + 0xcc);
                        iVar82 = *(int *)(local_840.hit + 0xd0);
                        iVar83 = *(int *)(local_840.hit + 0xd4);
                        iVar84 = *(int *)(local_840.hit + 0xd8);
                        iVar85 = *(int *)(local_840.hit + 0xdc);
                        iVar86 = *(int *)(local_840.hit + 0xe0);
                        iVar87 = *(int *)(local_840.hit + 0xe4);
                        iVar88 = *(int *)(local_840.hit + 0xe8);
                        iVar89 = *(int *)(local_840.hit + 0xec);
                        iVar90 = *(int *)(local_840.hit + 0xf0);
                        iVar91 = *(int *)(local_840.hit + 0xf4);
                        iVar92 = *(int *)(local_840.hit + 0xf8);
                        iVar93 = *(int *)(local_840.hit + 0xfc);
                        bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar31 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x3c0) =
                             (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0xc0) |
                             (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x3c0);
                        *(uint *)(local_840.ray + 0x3c4) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x3c4);
                        *(uint *)(local_840.ray + 0x3c8) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x3c8);
                        *(uint *)(local_840.ray + 0x3cc) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x3cc)
                        ;
                        *(uint *)(local_840.ray + 0x3d0) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x3d0)
                        ;
                        *(uint *)(local_840.ray + 0x3d4) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x3d4)
                        ;
                        *(uint *)(local_840.ray + 0x3d8) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x3d8)
                        ;
                        *(uint *)(local_840.ray + 0x3dc) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_840.ray + 0x3dc)
                        ;
                        *(uint *)(local_840.ray + 0x3e0) =
                             (uint)(bVar99 & 1) * iVar86 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x3e0);
                        *(uint *)(local_840.ray + 0x3e4) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x3e4)
                        ;
                        *(uint *)(local_840.ray + 1000) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 1000);
                        *(uint *)(local_840.ray + 0x3ec) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x3ec)
                        ;
                        *(uint *)(local_840.ray + 0x3f0) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x3f0)
                        ;
                        *(uint *)(local_840.ray + 0x3f4) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x3f4)
                        ;
                        *(uint *)(local_840.ray + 0x3f8) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x3f8)
                        ;
                        *(uint *)(local_840.ray + 0x3fc) =
                             (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_840.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_840.hit + 0x104);
                        iVar2 = *(int *)(local_840.hit + 0x108);
                        iVar81 = *(int *)(local_840.hit + 0x10c);
                        iVar82 = *(int *)(local_840.hit + 0x110);
                        iVar83 = *(int *)(local_840.hit + 0x114);
                        iVar84 = *(int *)(local_840.hit + 0x118);
                        iVar85 = *(int *)(local_840.hit + 0x11c);
                        iVar86 = *(int *)(local_840.hit + 0x120);
                        iVar87 = *(int *)(local_840.hit + 0x124);
                        iVar88 = *(int *)(local_840.hit + 0x128);
                        iVar89 = *(int *)(local_840.hit + 300);
                        iVar90 = *(int *)(local_840.hit + 0x130);
                        iVar91 = *(int *)(local_840.hit + 0x134);
                        iVar92 = *(int *)(local_840.hit + 0x138);
                        iVar93 = *(int *)(local_840.hit + 0x13c);
                        bVar18 = (bool)((byte)(uVar36 >> 1) & 1);
                        bVar19 = (bool)((byte)(uVar36 >> 2) & 1);
                        bVar20 = (bool)((byte)(uVar36 >> 3) & 1);
                        bVar21 = (bool)((byte)(uVar36 >> 4) & 1);
                        bVar22 = (bool)((byte)(uVar36 >> 5) & 1);
                        bVar23 = (bool)((byte)(uVar36 >> 6) & 1);
                        bVar24 = (bool)((byte)(uVar36 >> 7) & 1);
                        bVar25 = (bool)((byte)(uVar36 >> 9) & 1);
                        bVar26 = (bool)((byte)(uVar36 >> 10) & 1);
                        bVar27 = (bool)((byte)(uVar36 >> 0xb) & 1);
                        bVar28 = (bool)((byte)(uVar36 >> 0xc) & 1);
                        bVar29 = (bool)((byte)(uVar36 >> 0xd) & 1);
                        bVar30 = (bool)((byte)(uVar36 >> 0xe) & 1);
                        bVar31 = SUB81(uVar36 >> 0xf,0);
                        *(uint *)(local_840.ray + 0x400) =
                             (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0x100) |
                             (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x400);
                        *(uint *)(local_840.ray + 0x404) =
                             (uint)bVar18 * iVar1 | (uint)!bVar18 * *(int *)(local_840.ray + 0x404);
                        *(uint *)(local_840.ray + 0x408) =
                             (uint)bVar19 * iVar2 | (uint)!bVar19 * *(int *)(local_840.ray + 0x408);
                        *(uint *)(local_840.ray + 0x40c) =
                             (uint)bVar20 * iVar81 | (uint)!bVar20 * *(int *)(local_840.ray + 0x40c)
                        ;
                        *(uint *)(local_840.ray + 0x410) =
                             (uint)bVar21 * iVar82 | (uint)!bVar21 * *(int *)(local_840.ray + 0x410)
                        ;
                        *(uint *)(local_840.ray + 0x414) =
                             (uint)bVar22 * iVar83 | (uint)!bVar22 * *(int *)(local_840.ray + 0x414)
                        ;
                        *(uint *)(local_840.ray + 0x418) =
                             (uint)bVar23 * iVar84 | (uint)!bVar23 * *(int *)(local_840.ray + 0x418)
                        ;
                        *(uint *)(local_840.ray + 0x41c) =
                             (uint)bVar24 * iVar85 | (uint)!bVar24 * *(int *)(local_840.ray + 0x41c)
                        ;
                        *(uint *)(local_840.ray + 0x420) =
                             (uint)(bVar99 & 1) * iVar86 |
                             (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x420);
                        *(uint *)(local_840.ray + 0x424) =
                             (uint)bVar25 * iVar87 | (uint)!bVar25 * *(int *)(local_840.ray + 0x424)
                        ;
                        *(uint *)(local_840.ray + 0x428) =
                             (uint)bVar26 * iVar88 | (uint)!bVar26 * *(int *)(local_840.ray + 0x428)
                        ;
                        *(uint *)(local_840.ray + 0x42c) =
                             (uint)bVar27 * iVar89 | (uint)!bVar27 * *(int *)(local_840.ray + 0x42c)
                        ;
                        *(uint *)(local_840.ray + 0x430) =
                             (uint)bVar28 * iVar90 | (uint)!bVar28 * *(int *)(local_840.ray + 0x430)
                        ;
                        *(uint *)(local_840.ray + 0x434) =
                             (uint)bVar29 * iVar91 | (uint)!bVar29 * *(int *)(local_840.ray + 0x434)
                        ;
                        *(uint *)(local_840.ray + 0x438) =
                             (uint)bVar30 * iVar92 | (uint)!bVar30 * *(int *)(local_840.ray + 0x438)
                        ;
                        *(uint *)(local_840.ray + 0x43c) =
                             (uint)bVar31 * iVar93 | (uint)!bVar31 * *(int *)(local_840.ray + 0x43c)
                        ;
                        auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140));
                        auVar222 = vmovdqu32_avx512f(auVar222);
                        *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar222;
                        auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180));
                        auVar222 = vmovdqu32_avx512f(auVar222);
                        *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar222;
                        auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0));
                        auVar222 = vmovdqa32_avx512f(auVar222);
                        *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar222;
                        auVar222 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200));
                        auVar222 = vmovdqa32_avx512f(auVar222);
                        *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar222;
                        auVar238 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                      }
                      auVar131 = auVar239._0_32_;
                      bVar109 = ~(byte)(1 << ((uint)uVar100 & 0x1f)) & (byte)uVar104;
                      uVar171 = auVar238._0_4_;
                      auVar181._4_4_ = uVar171;
                      auVar181._0_4_ = uVar171;
                      auVar181._8_4_ = uVar171;
                      auVar181._12_4_ = uVar171;
                      auVar181._16_4_ = uVar171;
                      auVar181._20_4_ = uVar171;
                      auVar181._24_4_ = uVar171;
                      auVar181._28_4_ = uVar171;
                      uVar34 = vcmpps_avx512vl(auVar224._0_32_,auVar181,2);
                      if ((bVar109 & (byte)uVar34) == 0) goto LAB_01d62195;
                      bVar109 = bVar109 & (byte)uVar34;
                      uVar104 = (ulong)bVar109;
                      auVar182._8_4_ = 0x7f800000;
                      auVar182._0_8_ = 0x7f8000007f800000;
                      auVar182._12_4_ = 0x7f800000;
                      auVar182._16_4_ = 0x7f800000;
                      auVar182._20_4_ = 0x7f800000;
                      auVar182._24_4_ = 0x7f800000;
                      auVar182._28_4_ = 0x7f800000;
                      auVar125 = vblendmps_avx512vl(auVar182,auVar224._0_32_);
                      auVar161._0_4_ =
                           (uint)(bVar109 & 1) * auVar125._0_4_ |
                           (uint)!(bool)(bVar109 & 1) * 0x7f800000;
                      bVar18 = (bool)(bVar109 >> 1 & 1);
                      auVar161._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar109 >> 2 & 1);
                      auVar161._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar109 >> 3 & 1);
                      auVar161._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar109 >> 4 & 1);
                      auVar161._16_4_ = (uint)bVar18 * auVar125._16_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar109 >> 5 & 1);
                      auVar161._20_4_ = (uint)bVar18 * auVar125._20_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)(bVar109 >> 6 & 1);
                      auVar161._24_4_ = (uint)bVar18 * auVar125._24_4_ | (uint)!bVar18 * 0x7f800000;
                      auVar161._28_4_ =
                           (uint)(bVar109 >> 7) * auVar125._28_4_ |
                           (uint)!(bool)(bVar109 >> 7) * 0x7f800000;
                      auVar125 = vshufps_avx(auVar161,auVar161,0xb1);
                      auVar125 = vminps_avx(auVar161,auVar125);
                      auVar123 = vshufpd_avx(auVar125,auVar125,5);
                      auVar125 = vminps_avx(auVar125,auVar123);
                      auVar123 = vpermpd_avx2(auVar125,0x4e);
                      auVar125 = vminps_avx(auVar125,auVar123);
                      uVar34 = vcmpps_avx512vl(auVar161,auVar125,0);
                      bVar99 = (byte)uVar34 & bVar109;
                      if (bVar99 != 0) {
                        bVar109 = bVar99;
                      }
                      uVar101 = 0;
                      for (uVar102 = (uint)bVar109; (uVar102 & 1) == 0;
                          uVar102 = uVar102 >> 1 | 0x80000000) {
                        uVar101 = uVar101 + 1;
                      }
                      uVar100 = (ulong)uVar101;
                    } while( true );
                  }
                  fVar188 = local_500[uVar100];
                  uVar171 = *(undefined4 *)(local_4e0 + uVar100 * 4);
                  fVar184 = 1.0 - fVar188;
                  fVar170 = fVar184 * fVar184 * -3.0;
                  auVar213 = ZEXT464((uint)fVar170);
                  auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * fVar184)),
                                             ZEXT416((uint)(fVar188 * fVar184)),ZEXT416(0xc0000000))
                  ;
                  auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar188 * fVar184)),
                                             ZEXT416((uint)(fVar188 * fVar188)),ZEXT416(0x40000000))
                  ;
                  fVar184 = auVar117._0_4_ * 3.0;
                  fVar185 = auVar118._0_4_ * 3.0;
                  fVar197 = fVar188 * fVar188 * 3.0;
                  auVar214._0_4_ = fVar197 * local_880;
                  auVar214._4_4_ = fVar197 * fStack_87c;
                  auVar214._8_4_ = fVar197 * fStack_878;
                  auVar214._12_4_ = fVar197 * fStack_874;
                  auVar218 = ZEXT1664(auVar214);
                  auVar189._4_4_ = fVar185;
                  auVar189._0_4_ = fVar185;
                  auVar189._8_4_ = fVar185;
                  auVar189._12_4_ = fVar185;
                  auVar117 = vfmadd132ps_fma(auVar189,auVar214,*pauVar4);
                  auVar200._4_4_ = fVar184;
                  auVar200._0_4_ = fVar184;
                  auVar200._8_4_ = fVar184;
                  auVar200._12_4_ = fVar184;
                  auVar117 = vfmadd132ps_fma(auVar200,auVar117,*pauVar3);
                  auVar190._4_4_ = fVar170;
                  auVar190._0_4_ = fVar170;
                  auVar190._8_4_ = fVar170;
                  auVar190._12_4_ = fVar170;
                  auVar117 = vfmadd213ps_fma(auVar190,auVar32,auVar117);
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4c0 + uVar100 * 4);
                  *(int *)(ray + k * 4 + 0x300) = auVar117._0_4_;
                  uVar16 = vextractps_avx(auVar117,1);
                  *(undefined4 *)(ray + k * 4 + 0x340) = uVar16;
                  uVar16 = vextractps_avx(auVar117,2);
                  *(undefined4 *)(ray + k * 4 + 0x380) = uVar16;
                  *(float *)(ray + k * 4 + 0x3c0) = fVar188;
                  *(undefined4 *)(ray + k * 4 + 0x400) = uVar171;
                  *(uint *)(ray + k * 4 + 0x440) = uVar15;
                  *(uint *)(ray + k * 4 + 0x480) = uVar105;
                  *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
LAB_01d62195:
                  auVar222 = ZEXT1664(auVar32);
                }
              }
            }
          }
        }
      }
      if (8 < iVar103) {
        auVar125 = vpbroadcastd_avx512vl();
        auVar224 = ZEXT3264(auVar125);
        local_740._4_4_ = local_7e0._0_4_;
        local_740._0_4_ = local_7e0._0_4_;
        local_740._8_4_ = local_7e0._0_4_;
        local_740._12_4_ = local_7e0._0_4_;
        local_740._16_4_ = local_7e0._0_4_;
        local_740._20_4_ = local_7e0._0_4_;
        local_740._24_4_ = local_7e0._0_4_;
        local_740._28_4_ = local_7e0._0_4_;
        uStack_71c = local_720;
        uStack_718 = local_720;
        uStack_714 = local_720;
        uStack_710 = local_720;
        uStack_70c = local_720;
        uStack_708 = local_720;
        uStack_704 = local_720;
        fStack_798 = 1.0 / (float)local_440._0_4_;
        auVar239 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar239);
        auVar239 = vpbroadcastd_avx512f();
        local_400 = vmovdqa64_avx512f(auVar239);
        lVar107 = 8;
        local_800 = auVar131;
        fStack_794 = fStack_798;
        fStack_790 = fStack_798;
        fStack_78c = fStack_798;
        fStack_788 = fStack_798;
        fStack_784 = fStack_798;
        local_7a0._0_4_ = fStack_798;
        local_7a0._4_4_ = fStack_798;
LAB_01d6224a:
        auVar125 = vpbroadcastd_avx512vl();
        auVar125 = vpor_avx2(auVar125,_DAT_01fe9900);
        uVar35 = vpcmpgtd_avx512vl(auVar224._0_32_,auVar125);
        auVar125 = *(undefined1 (*) [32])(bezier_basis0 + lVar107 * 4 + lVar38);
        auVar123 = *(undefined1 (*) [32])(lVar38 + 0x21aa768 + lVar107 * 4);
        auVar136 = *(undefined1 (*) [32])(lVar38 + 0x21aabec + lVar107 * 4);
        auVar135 = *(undefined1 (*) [32])(lVar38 + 0x21ab070 + lVar107 * 4);
        auVar239._0_4_ = auVar135._0_4_ * (float)local_6a0._0_4_;
        auVar239._4_4_ = auVar135._4_4_ * (float)local_6a0._4_4_;
        auVar239._8_4_ = auVar135._8_4_ * fStack_698;
        auVar239._12_4_ = auVar135._12_4_ * fStack_694;
        auVar239._16_4_ = auVar135._16_4_ * fStack_690;
        auVar239._20_4_ = auVar135._20_4_ * fStack_68c;
        auVar239._28_36_ = auVar218._28_36_;
        auVar239._24_4_ = auVar135._24_4_ * fStack_688;
        auVar218._0_4_ = auVar135._0_4_ * (float)local_6c0._0_4_;
        auVar218._4_4_ = auVar135._4_4_ * (float)local_6c0._4_4_;
        auVar218._8_4_ = auVar135._8_4_ * fStack_6b8;
        auVar218._12_4_ = auVar135._12_4_ * fStack_6b4;
        auVar218._16_4_ = auVar135._16_4_ * fStack_6b0;
        auVar218._20_4_ = auVar135._20_4_ * fStack_6ac;
        auVar218._28_36_ = auVar213._28_36_;
        auVar218._24_4_ = auVar135._24_4_ * fStack_6a8;
        auVar126 = vmulps_avx512vl(local_3a0,auVar135);
        local_760 = auVar183._0_32_;
        auVar124 = vfmadd231ps_avx512vl(auVar239._0_32_,auVar136,local_660);
        auVar127 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar136,local_680);
        auVar126 = vfmadd231ps_avx512vl(auVar126,auVar136,local_380);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar123,local_620);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar123,local_640);
        auVar134 = vfmadd231ps_avx512vl(auVar126,auVar123,local_360);
        auVar117 = vfmadd231ps_fma(auVar124,auVar125,local_5e0);
        auVar218 = ZEXT1664(auVar117);
        auVar118 = vfmadd231ps_fma(auVar127,auVar125,local_600);
        auVar213 = ZEXT1664(auVar118);
        auVar126 = *(undefined1 (*) [32])(bezier_basis1 + lVar107 * 4 + lVar38);
        auVar124 = *(undefined1 (*) [32])(lVar38 + 0x21acb88 + lVar107 * 4);
        auVar122 = vfmadd231ps_avx512vl(auVar134,auVar125,local_340);
        auVar127 = *(undefined1 (*) [32])(lVar38 + 0x21ad00c + lVar107 * 4);
        auVar134 = *(undefined1 (*) [32])(lVar38 + 0x21ad490 + lVar107 * 4);
        auVar183._0_4_ = auVar134._0_4_ * (float)local_6a0._0_4_;
        auVar183._4_4_ = auVar134._4_4_ * (float)local_6a0._4_4_;
        auVar183._8_4_ = auVar134._8_4_ * fStack_698;
        auVar183._12_4_ = auVar134._12_4_ * fStack_694;
        auVar183._16_4_ = auVar134._16_4_ * fStack_690;
        auVar183._20_4_ = auVar134._20_4_ * fStack_68c;
        auVar183._28_36_ = auVar222._28_36_;
        auVar183._24_4_ = auVar134._24_4_ * fStack_688;
        auVar64._4_4_ = auVar134._4_4_ * (float)local_6c0._4_4_;
        auVar64._0_4_ = auVar134._0_4_ * (float)local_6c0._0_4_;
        auVar64._8_4_ = auVar134._8_4_ * fStack_6b8;
        auVar64._12_4_ = auVar134._12_4_ * fStack_6b4;
        auVar64._16_4_ = auVar134._16_4_ * fStack_6b0;
        auVar64._20_4_ = auVar134._20_4_ * fStack_6ac;
        auVar64._24_4_ = auVar134._24_4_ * fStack_6a8;
        auVar64._28_4_ = uStack_6a4;
        auVar128 = vmulps_avx512vl(local_3a0,auVar134);
        auVar129 = vfmadd231ps_avx512vl(auVar183._0_32_,auVar127,local_660);
        auVar183 = ZEXT3264(local_760);
        auVar130 = vfmadd231ps_avx512vl(auVar64,auVar127,local_680);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar127,local_380);
        auVar129 = vfmadd231ps_avx512vl(auVar129,auVar124,local_620);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar124,local_640);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar124,local_360);
        auVar8 = vfmadd231ps_fma(auVar129,auVar126,local_5e0);
        auVar222 = ZEXT1664(auVar8);
        auVar9 = vfmadd231ps_fma(auVar130,auVar126,local_600);
        auVar130 = vfmadd231ps_avx512vl(auVar128,auVar126,local_340);
        auVar131 = vmaxps_avx512vl(auVar122,auVar130);
        auVar128 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar117));
        auVar129 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar118));
        auVar120 = vmulps_avx512vl(ZEXT1632(auVar118),auVar128);
        auVar121 = vmulps_avx512vl(ZEXT1632(auVar117),auVar129);
        auVar120 = vsubps_avx512vl(auVar120,auVar121);
        auVar121 = vmulps_avx512vl(auVar129,auVar129);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar128,auVar128);
        auVar131 = vmulps_avx512vl(auVar131,auVar131);
        auVar131 = vmulps_avx512vl(auVar131,auVar121);
        auVar120 = vmulps_avx512vl(auVar120,auVar120);
        uVar34 = vcmpps_avx512vl(auVar120,auVar131,2);
        bVar109 = (byte)uVar35 & (byte)uVar34;
        if (bVar109 != 0) {
          auVar134 = vmulps_avx512vl(local_4a0,auVar134);
          auVar127 = vfmadd213ps_avx512vl(auVar127,local_800,auVar134);
          local_780 = auVar240._0_32_;
          auVar124 = vfmadd213ps_avx512vl(auVar124,local_780,auVar127);
          auVar126 = vfmadd213ps_avx512vl(auVar126,local_760,auVar124);
          auVar135 = vmulps_avx512vl(local_4a0,auVar135);
          auVar136 = vfmadd213ps_avx512vl(auVar136,local_800,auVar135);
          auVar123 = vfmadd213ps_avx512vl(auVar123,local_780,auVar136);
          auVar124 = vfmadd213ps_avx512vl(auVar125,local_760,auVar123);
          auVar125 = *(undefined1 (*) [32])(lVar38 + 0x21ab4f4 + lVar107 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar38 + 0x21ab978 + lVar107 * 4);
          auVar136 = *(undefined1 (*) [32])(lVar38 + 0x21abdfc + lVar107 * 4);
          auVar135 = *(undefined1 (*) [32])(lVar38 + 0x21ac280 + lVar107 * 4);
          auVar127 = vmulps_avx512vl(_local_6a0,auVar135);
          auVar134 = vmulps_avx512vl(_local_6c0,auVar135);
          auVar135 = vmulps_avx512vl(local_4a0,auVar135);
          auVar127 = vfmadd231ps_avx512vl(auVar127,auVar136,local_660);
          auVar134 = vfmadd231ps_avx512vl(auVar134,auVar136,local_680);
          auVar116 = vfmadd231ps_fma(auVar135,auVar136,local_800);
          auVar136 = vfmadd231ps_avx512vl(auVar127,auVar123,local_620);
          auVar135 = vfmadd231ps_avx512vl(auVar134,auVar123,local_640);
          auVar123 = vfmadd231ps_avx512vl(ZEXT1632(auVar116),local_780,auVar123);
          auVar127 = vfmadd231ps_avx512vl(auVar136,auVar125,local_5e0);
          auVar135 = vfmadd231ps_avx512vl(auVar135,auVar125,local_600);
          auVar134 = vfmadd231ps_avx512vl(auVar123,local_760,auVar125);
          auVar125 = *(undefined1 (*) [32])(lVar38 + 0x21ad914 + lVar107 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar38 + 0x21ae21c + lVar107 * 4);
          auVar136 = *(undefined1 (*) [32])(lVar38 + 0x21ae6a0 + lVar107 * 4);
          auVar131 = vmulps_avx512vl(_local_6a0,auVar136);
          auVar120 = vmulps_avx512vl(_local_6c0,auVar136);
          auVar136 = vmulps_avx512vl(local_4a0,auVar136);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar123,local_660);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_680);
          auVar136 = vfmadd231ps_avx512vl(auVar136,local_800,auVar123);
          auVar123 = *(undefined1 (*) [32])(lVar38 + 0x21add98 + lVar107 * 4);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar123,local_620);
          auVar183 = ZEXT3264(local_760);
          auVar120 = vfmadd231ps_avx512vl(auVar120,auVar123,local_640);
          auVar123 = vfmadd231ps_avx512vl(auVar136,local_780,auVar123);
          auVar136 = vfmadd231ps_avx512vl(auVar131,auVar125,local_5e0);
          auVar131 = vfmadd231ps_avx512vl(auVar120,auVar125,local_600);
          auVar123 = vfmadd231ps_avx512vl(auVar123,local_760,auVar125);
          auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar127,auVar120);
          vandps_avx512vl(auVar135,auVar120);
          auVar125 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar134,auVar120);
          auVar125 = vmaxps_avx(auVar125,auVar120);
          uVar100 = vcmpps_avx512vl(auVar125,local_740,1);
          bVar18 = (bool)((byte)uVar100 & 1);
          auVar149._0_4_ = (float)((uint)bVar18 * auVar128._0_4_ | (uint)!bVar18 * auVar127._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar149._4_4_ = (float)((uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar127._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar149._8_4_ = (float)((uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar127._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar149._12_4_ =
               (float)((uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar127._12_4_);
          bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
          auVar149._16_4_ =
               (float)((uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * auVar127._16_4_);
          bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
          auVar149._20_4_ =
               (float)((uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * auVar127._20_4_);
          bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
          auVar149._24_4_ =
               (float)((uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * auVar127._24_4_);
          bVar18 = SUB81(uVar100 >> 7,0);
          auVar149._28_4_ = (uint)bVar18 * auVar128._28_4_ | (uint)!bVar18 * auVar127._28_4_;
          bVar18 = (bool)((byte)uVar100 & 1);
          auVar150._0_4_ = (float)((uint)bVar18 * auVar129._0_4_ | (uint)!bVar18 * auVar135._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar150._4_4_ = (float)((uint)bVar18 * auVar129._4_4_ | (uint)!bVar18 * auVar135._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar150._8_4_ = (float)((uint)bVar18 * auVar129._8_4_ | (uint)!bVar18 * auVar135._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar150._12_4_ =
               (float)((uint)bVar18 * auVar129._12_4_ | (uint)!bVar18 * auVar135._12_4_);
          bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
          auVar150._16_4_ =
               (float)((uint)bVar18 * auVar129._16_4_ | (uint)!bVar18 * auVar135._16_4_);
          bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
          auVar150._20_4_ =
               (float)((uint)bVar18 * auVar129._20_4_ | (uint)!bVar18 * auVar135._20_4_);
          bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
          auVar150._24_4_ =
               (float)((uint)bVar18 * auVar129._24_4_ | (uint)!bVar18 * auVar135._24_4_);
          bVar18 = SUB81(uVar100 >> 7,0);
          auVar150._28_4_ = (uint)bVar18 * auVar129._28_4_ | (uint)!bVar18 * auVar135._28_4_;
          vandps_avx512vl(auVar136,auVar120);
          vandps_avx512vl(auVar131,auVar120);
          auVar125 = vmaxps_avx(auVar150,auVar150);
          vandps_avx512vl(auVar123,auVar120);
          auVar125 = vmaxps_avx(auVar125,auVar150);
          uVar100 = vcmpps_avx512vl(auVar125,local_740,1);
          bVar18 = (bool)((byte)uVar100 & 1);
          auVar151._0_4_ = (uint)bVar18 * auVar128._0_4_ | (uint)!bVar18 * auVar136._0_4_;
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar136._4_4_;
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar136._8_4_;
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar136._12_4_;
          bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
          auVar151._16_4_ = (uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * auVar136._16_4_;
          bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
          auVar151._20_4_ = (uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * auVar136._20_4_;
          bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
          auVar151._24_4_ = (uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * auVar136._24_4_;
          bVar18 = SUB81(uVar100 >> 7,0);
          auVar151._28_4_ = (uint)bVar18 * auVar128._28_4_ | (uint)!bVar18 * auVar136._28_4_;
          bVar18 = (bool)((byte)uVar100 & 1);
          auVar152._0_4_ = (float)((uint)bVar18 * auVar129._0_4_ | (uint)!bVar18 * auVar131._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar152._4_4_ = (float)((uint)bVar18 * auVar129._4_4_ | (uint)!bVar18 * auVar131._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar152._8_4_ = (float)((uint)bVar18 * auVar129._8_4_ | (uint)!bVar18 * auVar131._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar152._12_4_ =
               (float)((uint)bVar18 * auVar129._12_4_ | (uint)!bVar18 * auVar131._12_4_);
          bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
          auVar152._16_4_ =
               (float)((uint)bVar18 * auVar129._16_4_ | (uint)!bVar18 * auVar131._16_4_);
          bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
          auVar152._20_4_ =
               (float)((uint)bVar18 * auVar129._20_4_ | (uint)!bVar18 * auVar131._20_4_);
          bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
          auVar152._24_4_ =
               (float)((uint)bVar18 * auVar129._24_4_ | (uint)!bVar18 * auVar131._24_4_);
          bVar18 = SUB81(uVar100 >> 7,0);
          auVar152._28_4_ = (uint)bVar18 * auVar129._28_4_ | (uint)!bVar18 * auVar131._28_4_;
          auVar226._8_4_ = 0x80000000;
          auVar226._0_8_ = 0x8000000080000000;
          auVar226._12_4_ = 0x80000000;
          auVar226._16_4_ = 0x80000000;
          auVar226._20_4_ = 0x80000000;
          auVar226._24_4_ = 0x80000000;
          auVar226._28_4_ = 0x80000000;
          auVar125 = vxorps_avx512vl(auVar151,auVar226);
          auVar119 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
          auVar123 = vfmadd213ps_avx512vl(auVar149,auVar149,ZEXT1632(auVar119));
          auVar116 = vfmadd231ps_fma(auVar123,auVar150,auVar150);
          auVar123 = vrsqrt14ps_avx512vl(ZEXT1632(auVar116));
          auVar236._8_4_ = 0xbf000000;
          auVar236._0_8_ = 0xbf000000bf000000;
          auVar236._12_4_ = 0xbf000000;
          auVar236._16_4_ = 0xbf000000;
          auVar236._20_4_ = 0xbf000000;
          auVar236._24_4_ = 0xbf000000;
          auVar236._28_4_ = 0xbf000000;
          fVar188 = auVar123._0_4_;
          fVar170 = auVar123._4_4_;
          fVar184 = auVar123._8_4_;
          fVar185 = auVar123._12_4_;
          fVar197 = auVar123._16_4_;
          fVar207 = auVar123._20_4_;
          fVar110 = auVar123._24_4_;
          auVar65._4_4_ = fVar170 * fVar170 * fVar170 * auVar116._4_4_ * -0.5;
          auVar65._0_4_ = fVar188 * fVar188 * fVar188 * auVar116._0_4_ * -0.5;
          auVar65._8_4_ = fVar184 * fVar184 * fVar184 * auVar116._8_4_ * -0.5;
          auVar65._12_4_ = fVar185 * fVar185 * fVar185 * auVar116._12_4_ * -0.5;
          auVar65._16_4_ = fVar197 * fVar197 * fVar197 * -0.0;
          auVar65._20_4_ = fVar207 * fVar207 * fVar207 * -0.0;
          auVar65._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar65._28_4_ = auVar150._28_4_;
          auVar136 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar123 = vfmadd231ps_avx512vl(auVar65,auVar136,auVar123);
          auVar66._4_4_ = auVar150._4_4_ * auVar123._4_4_;
          auVar66._0_4_ = auVar150._0_4_ * auVar123._0_4_;
          auVar66._8_4_ = auVar150._8_4_ * auVar123._8_4_;
          auVar66._12_4_ = auVar150._12_4_ * auVar123._12_4_;
          auVar66._16_4_ = auVar150._16_4_ * auVar123._16_4_;
          auVar66._20_4_ = auVar150._20_4_ * auVar123._20_4_;
          auVar66._24_4_ = auVar150._24_4_ * auVar123._24_4_;
          auVar66._28_4_ = 0;
          auVar67._4_4_ = auVar123._4_4_ * -auVar149._4_4_;
          auVar67._0_4_ = auVar123._0_4_ * -auVar149._0_4_;
          auVar67._8_4_ = auVar123._8_4_ * -auVar149._8_4_;
          auVar67._12_4_ = auVar123._12_4_ * -auVar149._12_4_;
          auVar67._16_4_ = auVar123._16_4_ * -auVar149._16_4_;
          auVar67._20_4_ = auVar123._20_4_ * -auVar149._20_4_;
          auVar67._24_4_ = auVar123._24_4_ * -auVar149._24_4_;
          auVar67._28_4_ = auVar150._28_4_;
          auVar135 = vmulps_avx512vl(auVar123,ZEXT1632(auVar119));
          auVar134 = ZEXT1632(auVar119);
          auVar123 = vfmadd213ps_avx512vl(auVar151,auVar151,auVar134);
          auVar123 = vfmadd231ps_avx512vl(auVar123,auVar152,auVar152);
          auVar127 = vrsqrt14ps_avx512vl(auVar123);
          auVar123 = vmulps_avx512vl(auVar123,auVar236);
          fVar188 = auVar127._0_4_;
          fVar170 = auVar127._4_4_;
          fVar184 = auVar127._8_4_;
          fVar185 = auVar127._12_4_;
          fVar197 = auVar127._16_4_;
          fVar207 = auVar127._20_4_;
          fVar110 = auVar127._24_4_;
          auVar68._4_4_ = fVar170 * fVar170 * fVar170 * auVar123._4_4_;
          auVar68._0_4_ = fVar188 * fVar188 * fVar188 * auVar123._0_4_;
          auVar68._8_4_ = fVar184 * fVar184 * fVar184 * auVar123._8_4_;
          auVar68._12_4_ = fVar185 * fVar185 * fVar185 * auVar123._12_4_;
          auVar68._16_4_ = fVar197 * fVar197 * fVar197 * auVar123._16_4_;
          auVar68._20_4_ = fVar207 * fVar207 * fVar207 * auVar123._20_4_;
          auVar68._24_4_ = fVar110 * fVar110 * fVar110 * auVar123._24_4_;
          auVar68._28_4_ = auVar123._28_4_;
          auVar123 = vfmadd231ps_avx512vl(auVar68,auVar136,auVar127);
          auVar69._4_4_ = auVar152._4_4_ * auVar123._4_4_;
          auVar69._0_4_ = auVar152._0_4_ * auVar123._0_4_;
          auVar69._8_4_ = auVar152._8_4_ * auVar123._8_4_;
          auVar69._12_4_ = auVar152._12_4_ * auVar123._12_4_;
          auVar69._16_4_ = auVar152._16_4_ * auVar123._16_4_;
          auVar69._20_4_ = auVar152._20_4_ * auVar123._20_4_;
          auVar69._24_4_ = auVar152._24_4_ * auVar123._24_4_;
          auVar69._28_4_ = auVar127._28_4_;
          auVar70._4_4_ = auVar123._4_4_ * auVar125._4_4_;
          auVar70._0_4_ = auVar123._0_4_ * auVar125._0_4_;
          auVar70._8_4_ = auVar123._8_4_ * auVar125._8_4_;
          auVar70._12_4_ = auVar123._12_4_ * auVar125._12_4_;
          auVar70._16_4_ = auVar123._16_4_ * auVar125._16_4_;
          auVar70._20_4_ = auVar123._20_4_ * auVar125._20_4_;
          auVar70._24_4_ = auVar123._24_4_ * auVar125._24_4_;
          auVar70._28_4_ = auVar125._28_4_;
          auVar125 = vmulps_avx512vl(auVar123,auVar134);
          auVar116 = vfmadd213ps_fma(auVar66,auVar122,ZEXT1632(auVar117));
          auVar174 = vfmadd213ps_fma(auVar67,auVar122,ZEXT1632(auVar118));
          auVar136 = vfmadd213ps_avx512vl(auVar135,auVar122,auVar124);
          auVar127 = vfmadd213ps_avx512vl(auVar69,auVar130,ZEXT1632(auVar8));
          auVar112 = vfnmadd213ps_fma(auVar66,auVar122,ZEXT1632(auVar117));
          auVar117 = vfmadd213ps_fma(auVar70,auVar130,ZEXT1632(auVar9));
          auVar223 = vfnmadd213ps_fma(auVar67,auVar122,ZEXT1632(auVar118));
          auVar118 = vfmadd213ps_fma(auVar125,auVar130,auVar126);
          auVar39 = vfnmadd231ps_fma(auVar124,auVar122,auVar135);
          auVar198 = vfnmadd213ps_fma(auVar69,auVar130,ZEXT1632(auVar8));
          auVar113 = vfnmadd213ps_fma(auVar70,auVar130,ZEXT1632(auVar9));
          auVar114 = vfnmadd231ps_fma(auVar126,auVar130,auVar125);
          auVar126 = vsubps_avx512vl(auVar127,ZEXT1632(auVar112));
          auVar125 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar223));
          auVar123 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar39));
          auVar71._4_4_ = auVar125._4_4_ * auVar39._4_4_;
          auVar71._0_4_ = auVar125._0_4_ * auVar39._0_4_;
          auVar71._8_4_ = auVar125._8_4_ * auVar39._8_4_;
          auVar71._12_4_ = auVar125._12_4_ * auVar39._12_4_;
          auVar71._16_4_ = auVar125._16_4_ * 0.0;
          auVar71._20_4_ = auVar125._20_4_ * 0.0;
          auVar71._24_4_ = auVar125._24_4_ * 0.0;
          auVar71._28_4_ = auVar135._28_4_;
          auVar8 = vfmsub231ps_fma(auVar71,ZEXT1632(auVar223),auVar123);
          auVar72._4_4_ = auVar123._4_4_ * auVar112._4_4_;
          auVar72._0_4_ = auVar123._0_4_ * auVar112._0_4_;
          auVar72._8_4_ = auVar123._8_4_ * auVar112._8_4_;
          auVar72._12_4_ = auVar123._12_4_ * auVar112._12_4_;
          auVar72._16_4_ = auVar123._16_4_ * 0.0;
          auVar72._20_4_ = auVar123._20_4_ * 0.0;
          auVar72._24_4_ = auVar123._24_4_ * 0.0;
          auVar72._28_4_ = auVar123._28_4_;
          auVar9 = vfmsub231ps_fma(auVar72,ZEXT1632(auVar39),auVar126);
          auVar73._4_4_ = auVar223._4_4_ * auVar126._4_4_;
          auVar73._0_4_ = auVar223._0_4_ * auVar126._0_4_;
          auVar73._8_4_ = auVar223._8_4_ * auVar126._8_4_;
          auVar73._12_4_ = auVar223._12_4_ * auVar126._12_4_;
          auVar73._16_4_ = auVar126._16_4_ * 0.0;
          auVar73._20_4_ = auVar126._20_4_ * 0.0;
          auVar73._24_4_ = auVar126._24_4_ * 0.0;
          auVar73._28_4_ = auVar126._28_4_;
          auVar115 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar112),auVar125);
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar115),auVar134,ZEXT1632(auVar9));
          auVar125 = vfmadd231ps_avx512vl(auVar125,auVar134,ZEXT1632(auVar8));
          auVar120 = ZEXT1632(auVar119);
          uVar100 = vcmpps_avx512vl(auVar125,auVar120,2);
          bVar99 = (byte)uVar100;
          fVar162 = (float)((uint)(bVar99 & 1) * auVar116._0_4_ |
                           (uint)!(bool)(bVar99 & 1) * auVar198._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          fVar164 = (float)((uint)bVar18 * auVar116._4_4_ | (uint)!bVar18 * auVar198._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          fVar167 = (float)((uint)bVar18 * auVar116._8_4_ | (uint)!bVar18 * auVar198._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          fVar168 = (float)((uint)bVar18 * auVar116._12_4_ | (uint)!bVar18 * auVar198._12_4_);
          auVar134 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar167,CONCAT44(fVar164,fVar162))));
          fVar163 = (float)((uint)(bVar99 & 1) * auVar174._0_4_ |
                           (uint)!(bool)(bVar99 & 1) * auVar113._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          fVar166 = (float)((uint)bVar18 * auVar174._4_4_ | (uint)!bVar18 * auVar113._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          fVar165 = (float)((uint)bVar18 * auVar174._8_4_ | (uint)!bVar18 * auVar113._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          fVar169 = (float)((uint)bVar18 * auVar174._12_4_ | (uint)!bVar18 * auVar113._12_4_);
          auVar128 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar165,CONCAT44(fVar166,fVar163))));
          auVar153._0_4_ =
               (float)((uint)(bVar99 & 1) * auVar136._0_4_ |
                      (uint)!(bool)(bVar99 & 1) * auVar114._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar153._4_4_ = (float)((uint)bVar18 * auVar136._4_4_ | (uint)!bVar18 * auVar114._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar153._8_4_ = (float)((uint)bVar18 * auVar136._8_4_ | (uint)!bVar18 * auVar114._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar153._12_4_ =
               (float)((uint)bVar18 * auVar136._12_4_ | (uint)!bVar18 * auVar114._12_4_);
          fVar188 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar136._16_4_);
          auVar153._16_4_ = fVar188;
          fVar170 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar136._20_4_);
          auVar153._20_4_ = fVar170;
          fVar184 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar136._24_4_);
          auVar153._24_4_ = fVar184;
          iVar1 = (uint)(byte)(uVar100 >> 7) * auVar136._28_4_;
          auVar153._28_4_ = iVar1;
          auVar125 = vblendmps_avx512vl(ZEXT1632(auVar112),auVar127);
          auVar154._0_4_ =
               (uint)(bVar99 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar8._0_4_;
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar154._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar8._4_4_;
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar154._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar8._8_4_;
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar154._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar8._12_4_;
          auVar154._16_4_ = (uint)((byte)(uVar100 >> 4) & 1) * auVar125._16_4_;
          auVar154._20_4_ = (uint)((byte)(uVar100 >> 5) & 1) * auVar125._20_4_;
          auVar154._24_4_ = (uint)((byte)(uVar100 >> 6) & 1) * auVar125._24_4_;
          auVar154._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar125._28_4_;
          auVar125 = vblendmps_avx512vl(ZEXT1632(auVar223),ZEXT1632(auVar117));
          auVar155._0_4_ =
               (float)((uint)(bVar99 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar99 & 1) * auVar116._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar155._4_4_ = (float)((uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar116._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar155._8_4_ = (float)((uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar116._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar155._12_4_ =
               (float)((uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar116._12_4_);
          fVar207 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar125._16_4_);
          auVar155._16_4_ = fVar207;
          fVar197 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar125._20_4_);
          auVar155._20_4_ = fVar197;
          fVar185 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar125._24_4_);
          auVar155._24_4_ = fVar185;
          auVar155._28_4_ = (uint)(byte)(uVar100 >> 7) * auVar125._28_4_;
          auVar125 = vblendmps_avx512vl(ZEXT1632(auVar39),ZEXT1632(auVar118));
          auVar156._0_4_ =
               (float)((uint)(bVar99 & 1) * auVar125._0_4_ |
                      (uint)!(bool)(bVar99 & 1) * auVar174._0_4_);
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar156._4_4_ = (float)((uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * auVar174._4_4_);
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar156._8_4_ = (float)((uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * auVar174._8_4_);
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar156._12_4_ =
               (float)((uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * auVar174._12_4_);
          fVar110 = (float)((uint)((byte)(uVar100 >> 4) & 1) * auVar125._16_4_);
          auVar156._16_4_ = fVar110;
          fVar111 = (float)((uint)((byte)(uVar100 >> 5) & 1) * auVar125._20_4_);
          auVar156._20_4_ = fVar111;
          fVar196 = (float)((uint)((byte)(uVar100 >> 6) & 1) * auVar125._24_4_);
          auVar156._24_4_ = fVar196;
          iVar2 = (uint)(byte)(uVar100 >> 7) * auVar125._28_4_;
          auVar156._28_4_ = iVar2;
          auVar157._0_4_ =
               (uint)(bVar99 & 1) * (int)auVar112._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar127._0_4_
          ;
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          auVar157._4_4_ = (uint)bVar18 * (int)auVar112._4_4_ | (uint)!bVar18 * auVar127._4_4_;
          bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
          auVar157._8_4_ = (uint)bVar18 * (int)auVar112._8_4_ | (uint)!bVar18 * auVar127._8_4_;
          bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar157._12_4_ = (uint)bVar18 * (int)auVar112._12_4_ | (uint)!bVar18 * auVar127._12_4_;
          auVar157._16_4_ = (uint)!(bool)((byte)(uVar100 >> 4) & 1) * auVar127._16_4_;
          auVar157._20_4_ = (uint)!(bool)((byte)(uVar100 >> 5) & 1) * auVar127._20_4_;
          auVar157._24_4_ = (uint)!(bool)((byte)(uVar100 >> 6) & 1) * auVar127._24_4_;
          auVar157._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar127._28_4_;
          bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
          bVar20 = (bool)((byte)(uVar100 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar100 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar100 >> 1) & 1);
          bVar21 = (bool)((byte)(uVar100 >> 2) & 1);
          bVar23 = (bool)((byte)(uVar100 >> 3) & 1);
          auVar127 = vsubps_avx512vl(auVar157,auVar134);
          auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar22 * (int)auVar223._12_4_ |
                                                   (uint)!bVar22 * auVar117._12_4_,
                                                   CONCAT48((uint)bVar20 * (int)auVar223._8_4_ |
                                                            (uint)!bVar20 * auVar117._8_4_,
                                                            CONCAT44((uint)bVar18 *
                                                                     (int)auVar223._4_4_ |
                                                                     (uint)!bVar18 * auVar117._4_4_,
                                                                     (uint)(bVar99 & 1) *
                                                                     (int)auVar223._0_4_ |
                                                                     (uint)!(bool)(bVar99 & 1) *
                                                                     auVar117._0_4_)))),auVar128);
          auVar218 = ZEXT3264(auVar123);
          auVar136 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar39._12_4_ |
                                                   (uint)!bVar23 * auVar118._12_4_,
                                                   CONCAT48((uint)bVar21 * (int)auVar39._8_4_ |
                                                            (uint)!bVar21 * auVar118._8_4_,
                                                            CONCAT44((uint)bVar19 *
                                                                     (int)auVar39._4_4_ |
                                                                     (uint)!bVar19 * auVar118._4_4_,
                                                                     (uint)(bVar99 & 1) *
                                                                     (int)auVar39._0_4_ |
                                                                     (uint)!(bool)(bVar99 & 1) *
                                                                     auVar118._0_4_)))),auVar153);
          auVar135 = vsubps_avx(auVar134,auVar154);
          auVar222 = ZEXT3264(auVar135);
          auVar126 = vsubps_avx(auVar128,auVar155);
          auVar124 = vsubps_avx(auVar153,auVar156);
          auVar74._4_4_ = auVar136._4_4_ * fVar164;
          auVar74._0_4_ = auVar136._0_4_ * fVar162;
          auVar74._8_4_ = auVar136._8_4_ * fVar167;
          auVar74._12_4_ = auVar136._12_4_ * fVar168;
          auVar74._16_4_ = auVar136._16_4_ * 0.0;
          auVar74._20_4_ = auVar136._20_4_ * 0.0;
          auVar74._24_4_ = auVar136._24_4_ * 0.0;
          auVar74._28_4_ = 0;
          auVar117 = vfmsub231ps_fma(auVar74,auVar153,auVar127);
          auVar205._0_4_ = fVar163 * auVar127._0_4_;
          auVar205._4_4_ = fVar166 * auVar127._4_4_;
          auVar205._8_4_ = fVar165 * auVar127._8_4_;
          auVar205._12_4_ = fVar169 * auVar127._12_4_;
          auVar205._16_4_ = auVar127._16_4_ * 0.0;
          auVar205._20_4_ = auVar127._20_4_ * 0.0;
          auVar205._24_4_ = auVar127._24_4_ * 0.0;
          auVar205._28_4_ = 0;
          auVar118 = vfmsub231ps_fma(auVar205,auVar134,auVar123);
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar120,ZEXT1632(auVar117));
          auVar211._0_4_ = auVar123._0_4_ * auVar153._0_4_;
          auVar211._4_4_ = auVar123._4_4_ * auVar153._4_4_;
          auVar211._8_4_ = auVar123._8_4_ * auVar153._8_4_;
          auVar211._12_4_ = auVar123._12_4_ * auVar153._12_4_;
          auVar211._16_4_ = auVar123._16_4_ * fVar188;
          auVar211._20_4_ = auVar123._20_4_ * fVar170;
          auVar211._24_4_ = auVar123._24_4_ * fVar184;
          auVar211._28_4_ = 0;
          auVar117 = vfmsub231ps_fma(auVar211,auVar128,auVar136);
          auVar129 = vfmadd231ps_avx512vl(auVar125,auVar120,ZEXT1632(auVar117));
          auVar125 = vmulps_avx512vl(auVar124,auVar154);
          auVar125 = vfmsub231ps_avx512vl(auVar125,auVar135,auVar156);
          auVar75._4_4_ = auVar126._4_4_ * auVar156._4_4_;
          auVar75._0_4_ = auVar126._0_4_ * auVar156._0_4_;
          auVar75._8_4_ = auVar126._8_4_ * auVar156._8_4_;
          auVar75._12_4_ = auVar126._12_4_ * auVar156._12_4_;
          auVar75._16_4_ = auVar126._16_4_ * fVar110;
          auVar75._20_4_ = auVar126._20_4_ * fVar111;
          auVar75._24_4_ = auVar126._24_4_ * fVar196;
          auVar75._28_4_ = iVar2;
          auVar117 = vfmsub231ps_fma(auVar75,auVar155,auVar124);
          auVar212._0_4_ = auVar155._0_4_ * auVar135._0_4_;
          auVar212._4_4_ = auVar155._4_4_ * auVar135._4_4_;
          auVar212._8_4_ = auVar155._8_4_ * auVar135._8_4_;
          auVar212._12_4_ = auVar155._12_4_ * auVar135._12_4_;
          auVar212._16_4_ = fVar207 * auVar135._16_4_;
          auVar212._20_4_ = fVar197 * auVar135._20_4_;
          auVar212._24_4_ = fVar185 * auVar135._24_4_;
          auVar212._28_4_ = 0;
          auVar118 = vfmsub231ps_fma(auVar212,auVar126,auVar154);
          auVar125 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),auVar120,auVar125);
          auVar131 = vfmadd231ps_avx512vl(auVar125,auVar120,ZEXT1632(auVar117));
          auVar213 = ZEXT3264(auVar131);
          auVar125 = vmaxps_avx(auVar129,auVar131);
          uVar34 = vcmpps_avx512vl(auVar125,auVar120,2);
          bVar109 = bVar109 & (byte)uVar34;
          if (bVar109 != 0) {
            uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar237._4_4_ = uVar171;
            auVar237._0_4_ = uVar171;
            auVar237._8_4_ = uVar171;
            auVar237._12_4_ = uVar171;
            auVar237._16_4_ = uVar171;
            auVar237._20_4_ = uVar171;
            auVar237._24_4_ = uVar171;
            auVar237._28_4_ = uVar171;
            auVar238 = ZEXT3264(auVar237);
            auVar76._4_4_ = auVar124._4_4_ * auVar123._4_4_;
            auVar76._0_4_ = auVar124._0_4_ * auVar123._0_4_;
            auVar76._8_4_ = auVar124._8_4_ * auVar123._8_4_;
            auVar76._12_4_ = auVar124._12_4_ * auVar123._12_4_;
            auVar76._16_4_ = auVar124._16_4_ * auVar123._16_4_;
            auVar76._20_4_ = auVar124._20_4_ * auVar123._20_4_;
            auVar76._24_4_ = auVar124._24_4_ * auVar123._24_4_;
            auVar76._28_4_ = auVar125._28_4_;
            auVar9 = vfmsub231ps_fma(auVar76,auVar126,auVar136);
            auVar77._4_4_ = auVar136._4_4_ * auVar135._4_4_;
            auVar77._0_4_ = auVar136._0_4_ * auVar135._0_4_;
            auVar77._8_4_ = auVar136._8_4_ * auVar135._8_4_;
            auVar77._12_4_ = auVar136._12_4_ * auVar135._12_4_;
            auVar77._16_4_ = auVar136._16_4_ * auVar135._16_4_;
            auVar77._20_4_ = auVar136._20_4_ * auVar135._20_4_;
            auVar77._24_4_ = auVar136._24_4_ * auVar135._24_4_;
            auVar77._28_4_ = auVar136._28_4_;
            auVar8 = vfmsub231ps_fma(auVar77,auVar127,auVar124);
            auVar78._4_4_ = auVar126._4_4_ * auVar127._4_4_;
            auVar78._0_4_ = auVar126._0_4_ * auVar127._0_4_;
            auVar78._8_4_ = auVar126._8_4_ * auVar127._8_4_;
            auVar78._12_4_ = auVar126._12_4_ * auVar127._12_4_;
            auVar78._16_4_ = auVar126._16_4_ * auVar127._16_4_;
            auVar78._20_4_ = auVar126._20_4_ * auVar127._20_4_;
            auVar78._24_4_ = auVar126._24_4_ * auVar127._24_4_;
            auVar78._28_4_ = auVar126._28_4_;
            auVar116 = vfmsub231ps_fma(auVar78,auVar135,auVar123);
            auVar117 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar8),ZEXT1632(auVar116));
            auVar118 = vfmadd231ps_fma(ZEXT1632(auVar117),ZEXT1632(auVar9),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar125 = vrcp14ps_avx512vl(ZEXT1632(auVar118));
            auVar222 = ZEXT3264(auVar125);
            auVar44._8_4_ = 0x3f800000;
            auVar44._0_8_ = 0x3f8000003f800000;
            auVar44._12_4_ = 0x3f800000;
            auVar44._16_4_ = 0x3f800000;
            auVar44._20_4_ = 0x3f800000;
            auVar44._24_4_ = 0x3f800000;
            auVar44._28_4_ = 0x3f800000;
            auVar123 = vfnmadd213ps_avx512vl(auVar125,ZEXT1632(auVar118),auVar44);
            auVar117 = vfmadd132ps_fma(auVar123,auVar125,auVar125);
            auVar218 = ZEXT1664(auVar117);
            auVar79._4_4_ = auVar116._4_4_ * auVar153._4_4_;
            auVar79._0_4_ = auVar116._0_4_ * auVar153._0_4_;
            auVar79._8_4_ = auVar116._8_4_ * auVar153._8_4_;
            auVar79._12_4_ = auVar116._12_4_ * auVar153._12_4_;
            auVar79._16_4_ = fVar188 * 0.0;
            auVar79._20_4_ = fVar170 * 0.0;
            auVar79._24_4_ = fVar184 * 0.0;
            auVar79._28_4_ = iVar1;
            auVar8 = vfmadd231ps_fma(auVar79,auVar128,ZEXT1632(auVar8));
            auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar134,ZEXT1632(auVar9));
            fVar188 = auVar117._0_4_;
            fVar170 = auVar117._4_4_;
            fVar184 = auVar117._8_4_;
            fVar185 = auVar117._12_4_;
            local_580 = ZEXT1632(CONCAT412(auVar8._12_4_ * fVar185,
                                           CONCAT48(auVar8._8_4_ * fVar184,
                                                    CONCAT44(auVar8._4_4_ * fVar170,
                                                             auVar8._0_4_ * fVar188))));
            auVar239 = ZEXT3264(local_580);
            uVar34 = vcmpps_avx512vl(local_580,auVar237,2);
            auVar98._4_4_ = uStack_71c;
            auVar98._0_4_ = local_720;
            auVar98._8_4_ = uStack_718;
            auVar98._12_4_ = uStack_714;
            auVar98._16_4_ = uStack_710;
            auVar98._20_4_ = uStack_70c;
            auVar98._24_4_ = uStack_708;
            auVar98._28_4_ = uStack_704;
            uVar35 = vcmpps_avx512vl(local_580,auVar98,0xd);
            bVar109 = (byte)uVar34 & (byte)uVar35 & bVar109;
            if (bVar109 != 0) {
              uVar104 = vcmpps_avx512vl(ZEXT1632(auVar118),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar104 = bVar109 & uVar104;
              if ((char)uVar104 != '\0') {
                fVar197 = auVar129._0_4_ * fVar188;
                fVar207 = auVar129._4_4_ * fVar170;
                auVar80._4_4_ = fVar207;
                auVar80._0_4_ = fVar197;
                fVar110 = auVar129._8_4_ * fVar184;
                auVar80._8_4_ = fVar110;
                fVar111 = auVar129._12_4_ * fVar185;
                auVar80._12_4_ = fVar111;
                fVar196 = auVar129._16_4_ * 0.0;
                auVar80._16_4_ = fVar196;
                fVar162 = auVar129._20_4_ * 0.0;
                auVar80._20_4_ = fVar162;
                fVar163 = auVar129._24_4_ * 0.0;
                auVar80._24_4_ = fVar163;
                auVar80._28_4_ = auVar129._28_4_;
                auVar195._8_4_ = 0x3f800000;
                auVar195._0_8_ = 0x3f8000003f800000;
                auVar195._12_4_ = 0x3f800000;
                auVar195._16_4_ = 0x3f800000;
                auVar195._20_4_ = 0x3f800000;
                auVar195._24_4_ = 0x3f800000;
                auVar195._28_4_ = 0x3f800000;
                auVar125 = vsubps_avx(auVar195,auVar80);
                local_5c0._0_4_ =
                     (float)((uint)(bVar99 & 1) * (int)fVar197 |
                            (uint)!(bool)(bVar99 & 1) * auVar125._0_4_);
                bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
                local_5c0._4_4_ =
                     (float)((uint)bVar18 * (int)fVar207 | (uint)!bVar18 * auVar125._4_4_);
                bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
                local_5c0._8_4_ =
                     (float)((uint)bVar18 * (int)fVar110 | (uint)!bVar18 * auVar125._8_4_);
                bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
                local_5c0._12_4_ =
                     (float)((uint)bVar18 * (int)fVar111 | (uint)!bVar18 * auVar125._12_4_);
                bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
                local_5c0._16_4_ =
                     (float)((uint)bVar18 * (int)fVar196 | (uint)!bVar18 * auVar125._16_4_);
                bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
                local_5c0._20_4_ =
                     (float)((uint)bVar18 * (int)fVar162 | (uint)!bVar18 * auVar125._20_4_);
                bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
                local_5c0._24_4_ =
                     (float)((uint)bVar18 * (int)fVar163 | (uint)!bVar18 * auVar125._24_4_);
                bVar18 = SUB81(uVar100 >> 7,0);
                local_5c0._28_4_ =
                     (float)((uint)bVar18 * auVar129._28_4_ | (uint)!bVar18 * auVar125._28_4_);
                auVar125 = vsubps_avx(auVar130,auVar122);
                auVar117 = vfmadd213ps_fma(auVar125,local_5c0,auVar122);
                uVar171 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar45._4_4_ = uVar171;
                auVar45._0_4_ = uVar171;
                auVar45._8_4_ = uVar171;
                auVar45._12_4_ = uVar171;
                auVar45._16_4_ = uVar171;
                auVar45._20_4_ = uVar171;
                auVar45._24_4_ = uVar171;
                auVar45._28_4_ = uVar171;
                auVar125 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar117._12_4_ + auVar117._12_4_,
                                                              CONCAT48(auVar117._8_4_ +
                                                                       auVar117._8_4_,
                                                                       CONCAT44(auVar117._4_4_ +
                                                                                auVar117._4_4_,
                                                                                auVar117._0_4_ +
                                                                                auVar117._0_4_)))),
                                           auVar45);
                uVar36 = vcmpps_avx512vl(local_580,auVar125,6);
                uVar104 = uVar104 & uVar36;
                bVar109 = (byte)uVar104;
                if (bVar109 != 0) {
                  auVar187._0_4_ = auVar131._0_4_ * fVar188;
                  auVar187._4_4_ = auVar131._4_4_ * fVar170;
                  auVar187._8_4_ = auVar131._8_4_ * fVar184;
                  auVar187._12_4_ = auVar131._12_4_ * fVar185;
                  auVar187._16_4_ = auVar131._16_4_ * 0.0;
                  auVar187._20_4_ = auVar131._20_4_ * 0.0;
                  auVar187._24_4_ = auVar131._24_4_ * 0.0;
                  auVar187._28_4_ = 0;
                  auVar206._8_4_ = 0x3f800000;
                  auVar206._0_8_ = 0x3f8000003f800000;
                  auVar206._12_4_ = 0x3f800000;
                  auVar206._16_4_ = 0x3f800000;
                  auVar206._20_4_ = 0x3f800000;
                  auVar206._24_4_ = 0x3f800000;
                  auVar206._28_4_ = 0x3f800000;
                  auVar125 = vsubps_avx(auVar206,auVar187);
                  auVar158._0_4_ =
                       (uint)(bVar99 & 1) * (int)auVar187._0_4_ |
                       (uint)!(bool)(bVar99 & 1) * auVar125._0_4_;
                  bVar18 = (bool)((byte)(uVar100 >> 1) & 1);
                  auVar158._4_4_ =
                       (uint)bVar18 * (int)auVar187._4_4_ | (uint)!bVar18 * auVar125._4_4_;
                  bVar18 = (bool)((byte)(uVar100 >> 2) & 1);
                  auVar158._8_4_ =
                       (uint)bVar18 * (int)auVar187._8_4_ | (uint)!bVar18 * auVar125._8_4_;
                  bVar18 = (bool)((byte)(uVar100 >> 3) & 1);
                  auVar158._12_4_ =
                       (uint)bVar18 * (int)auVar187._12_4_ | (uint)!bVar18 * auVar125._12_4_;
                  bVar18 = (bool)((byte)(uVar100 >> 4) & 1);
                  auVar158._16_4_ =
                       (uint)bVar18 * (int)auVar187._16_4_ | (uint)!bVar18 * auVar125._16_4_;
                  bVar18 = (bool)((byte)(uVar100 >> 5) & 1);
                  auVar158._20_4_ =
                       (uint)bVar18 * (int)auVar187._20_4_ | (uint)!bVar18 * auVar125._20_4_;
                  bVar18 = (bool)((byte)(uVar100 >> 6) & 1);
                  auVar158._24_4_ =
                       (uint)bVar18 * (int)auVar187._24_4_ | (uint)!bVar18 * auVar125._24_4_;
                  auVar158._28_4_ = (uint)!SUB81(uVar100 >> 7,0) * auVar125._28_4_;
                  auVar46._8_4_ = 0x40000000;
                  auVar46._0_8_ = 0x4000000040000000;
                  auVar46._12_4_ = 0x40000000;
                  auVar46._16_4_ = 0x40000000;
                  auVar46._20_4_ = 0x40000000;
                  auVar46._24_4_ = 0x40000000;
                  auVar46._28_4_ = 0x40000000;
                  local_5a0 = vfmsub132ps_avx512vl(auVar158,auVar206,auVar46);
                  local_560 = (undefined4)lVar107;
                  auVar222 = ZEXT1664(auVar32);
                  pGVar108 = (context->scene->geometries).items[uVar105].ptr;
                  if ((pGVar108->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar117 = vcvtsi2ss_avx512f(auVar119,local_560);
                    fVar188 = auVar117._0_4_;
                    local_500[0] = (fVar188 + local_5c0._0_4_ + 0.0) * (float)local_7a0;
                    local_500[1] = (fVar188 + local_5c0._4_4_ + 1.0) * local_7a0._4_4_;
                    local_500[2] = (fVar188 + local_5c0._8_4_ + 2.0) * fStack_798;
                    local_500[3] = (fVar188 + local_5c0._12_4_ + 3.0) * fStack_794;
                    fStack_4f0 = (fVar188 + local_5c0._16_4_ + 4.0) * fStack_790;
                    fStack_4ec = (fVar188 + local_5c0._20_4_ + 5.0) * fStack_78c;
                    fStack_4e8 = (fVar188 + local_5c0._24_4_ + 6.0) * fStack_788;
                    fStack_4e4 = fVar188 + local_5c0._28_4_ + 7.0;
                    local_4e0 = local_5a0;
                    local_4c0 = local_580;
                    auVar178._8_4_ = 0x7f800000;
                    auVar178._0_8_ = 0x7f8000007f800000;
                    auVar178._12_4_ = 0x7f800000;
                    auVar178._16_4_ = 0x7f800000;
                    auVar178._20_4_ = 0x7f800000;
                    auVar178._24_4_ = 0x7f800000;
                    auVar178._28_4_ = 0x7f800000;
                    auVar125 = vblendmps_avx512vl(auVar178,local_580);
                    auVar159._0_4_ =
                         (uint)(bVar109 & 1) * auVar125._0_4_ |
                         (uint)!(bool)(bVar109 & 1) * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar104 >> 1) & 1);
                    auVar159._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar104 >> 2) & 1);
                    auVar159._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar104 >> 3) & 1);
                    auVar159._12_4_ = (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar104 >> 4) & 1);
                    auVar159._16_4_ = (uint)bVar18 * auVar125._16_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar104 >> 5) & 1);
                    auVar159._20_4_ = (uint)bVar18 * auVar125._20_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = (bool)((byte)(uVar104 >> 6) & 1);
                    auVar159._24_4_ = (uint)bVar18 * auVar125._24_4_ | (uint)!bVar18 * 0x7f800000;
                    bVar18 = SUB81(uVar104 >> 7,0);
                    auVar159._28_4_ = (uint)bVar18 * auVar125._28_4_ | (uint)!bVar18 * 0x7f800000;
                    auVar125 = vshufps_avx(auVar159,auVar159,0xb1);
                    auVar125 = vminps_avx(auVar159,auVar125);
                    auVar123 = vshufpd_avx(auVar125,auVar125,5);
                    auVar125 = vminps_avx(auVar125,auVar123);
                    auVar123 = vpermpd_avx2(auVar125,0x4e);
                    auVar125 = vminps_avx(auVar125,auVar123);
                    uVar34 = vcmpps_avx512vl(auVar159,auVar125,0);
                    uVar101 = (uint)uVar104;
                    if (((byte)uVar34 & bVar109) != 0) {
                      uVar101 = (uint)((byte)uVar34 & bVar109);
                    }
                    uVar102 = 0;
                    for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
                      uVar102 = uVar102 + 1;
                    }
                    uVar100 = (ulong)uVar102;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar108->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_3c0 = vmovdqa64_avx512vl(auVar224._0_32_);
                      local_7c0._0_4_ = iVar103;
                      local_480._0_32_ = local_580;
                      local_808 = uVar106;
                      local_55c = iVar103;
                      local_550 = auVar32;
                      local_540 = uVar33;
                      uStack_538 = uVar37;
                      local_530 = uVar94;
                      uStack_528 = uVar95;
                      local_520 = uVar96;
                      uStack_518 = uVar97;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_500[uVar100]));
                        local_1c0 = vbroadcastss_avx512f
                                              (ZEXT416(*(uint *)(local_4e0 + uVar100 * 4)));
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4c0 + uVar100 * 4);
                        local_840.context = context->user;
                        fVar185 = local_200._0_4_;
                        fVar170 = 1.0 - fVar185;
                        fVar188 = fVar170 * fVar170 * -3.0;
                        auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar170 * fVar170)),
                                                   ZEXT416((uint)(fVar185 * fVar170)),
                                                   ZEXT416(0xc0000000));
                        auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar185 * fVar170)),
                                                   ZEXT416((uint)(fVar185 * fVar185)),
                                                   ZEXT416(0x40000000));
                        fVar170 = auVar117._0_4_ * 3.0;
                        fVar184 = auVar118._0_4_ * 3.0;
                        fVar185 = fVar185 * fVar185 * 3.0;
                        auVar216._0_4_ = fVar185 * local_880;
                        auVar216._4_4_ = fVar185 * fStack_87c;
                        auVar216._8_4_ = fVar185 * fStack_878;
                        auVar216._12_4_ = fVar185 * fStack_874;
                        auVar172._4_4_ = fVar184;
                        auVar172._0_4_ = fVar184;
                        auVar172._8_4_ = fVar184;
                        auVar172._12_4_ = fVar184;
                        auVar117 = vfmadd132ps_fma(auVar172,auVar216,auVar12);
                        auVar202._4_4_ = fVar170;
                        auVar202._0_4_ = fVar170;
                        auVar202._8_4_ = fVar170;
                        auVar202._12_4_ = fVar170;
                        auVar117 = vfmadd132ps_fma(auVar202,auVar117,auVar13);
                        auVar173._4_4_ = fVar188;
                        auVar173._0_4_ = fVar188;
                        auVar173._8_4_ = fVar188;
                        auVar173._12_4_ = fVar188;
                        auVar117 = vfmadd213ps_fma(auVar173,auVar32,auVar117);
                        auVar183 = vbroadcastss_avx512f(auVar117);
                        auVar213 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar213 = vpermps_avx512f(auVar213,ZEXT1664(auVar117));
                        auVar218 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar218,ZEXT1664(auVar117));
                        local_2c0[0] = (RTCHitN)auVar183[0];
                        local_2c0[1] = (RTCHitN)auVar183[1];
                        local_2c0[2] = (RTCHitN)auVar183[2];
                        local_2c0[3] = (RTCHitN)auVar183[3];
                        local_2c0[4] = (RTCHitN)auVar183[4];
                        local_2c0[5] = (RTCHitN)auVar183[5];
                        local_2c0[6] = (RTCHitN)auVar183[6];
                        local_2c0[7] = (RTCHitN)auVar183[7];
                        local_2c0[8] = (RTCHitN)auVar183[8];
                        local_2c0[9] = (RTCHitN)auVar183[9];
                        local_2c0[10] = (RTCHitN)auVar183[10];
                        local_2c0[0xb] = (RTCHitN)auVar183[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar183[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar183[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar183[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar183[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar183[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar183[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar183[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar183[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar183[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar183[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar183[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar183[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar183[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar183[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar183[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar183[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar183[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar183[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar183[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar183[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar183[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar183[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar183[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar183[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar183[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar183[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar183[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar183[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar183[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar183[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar183[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar183[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar183[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar183[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar183[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar183[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar183[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar183[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar183[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar183[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar183[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar183[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar183[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar183[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar183[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar183[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar183[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar183[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar183[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar183[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar183[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar183[0x3f];
                        local_280 = auVar213;
                        local_180 = local_400._0_8_;
                        uStack_178 = local_400._8_8_;
                        uStack_170 = local_400._16_8_;
                        uStack_168 = local_400._24_8_;
                        uStack_160 = local_400._32_8_;
                        uStack_158 = local_400._40_8_;
                        uStack_150 = local_400._48_8_;
                        uStack_148 = local_400._56_8_;
                        auVar183 = vmovdqa64_avx512f(local_440);
                        local_140 = vmovdqa64_avx512f(auVar183);
                        auVar125 = vpcmpeqd_avx2(auVar183._0_32_,auVar183._0_32_);
                        local_810[3] = auVar125;
                        local_810[2] = auVar125;
                        local_810[1] = auVar125;
                        *local_810 = auVar125;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_840.context)->instPrimID[0]))
                        ;
                        auVar183 = vmovdqa64_avx512f(local_300);
                        local_700 = vmovdqa64_avx512f(auVar183);
                        local_840.valid = (int *)local_700;
                        local_840.geometryUserPtr = pGVar108->userPtr;
                        local_840.hit = local_2c0;
                        local_840.N = 0x10;
                        local_7e0 = auVar238._0_32_;
                        local_840.ray = (RTCRayN *)ray;
                        if (pGVar108->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar213 = ZEXT1664(auVar213._0_16_);
                          auVar218 = ZEXT1664(auVar218._0_16_);
                          (*pGVar108->intersectionFilterN)(&local_840);
                          auVar239 = ZEXT3264(local_480._0_32_);
                          auVar238 = ZEXT3264(local_7e0);
                          auVar183 = vmovdqa64_avx512f(local_700);
                        }
                        uVar34 = vptestmd_avx512f(auVar183,auVar183);
                        if ((short)uVar34 == 0) {
LAB_01d62e50:
                          *(int *)(ray + k * 4 + 0x200) = auVar238._0_4_;
                        }
                        else {
                          p_Var17 = context->args->filter;
                          if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar108->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar213 = ZEXT1664(auVar213._0_16_);
                            auVar218 = ZEXT1664(auVar218._0_16_);
                            (*p_Var17)(&local_840);
                            auVar239 = ZEXT3264(local_480._0_32_);
                            auVar238 = ZEXT3264(local_7e0);
                            auVar183 = vmovdqa64_avx512f(local_700);
                          }
                          uVar106 = vptestmd_avx512f(auVar183,auVar183);
                          if ((short)uVar106 == 0) goto LAB_01d62e50;
                          iVar103 = *(int *)(local_840.hit + 4);
                          iVar1 = *(int *)(local_840.hit + 8);
                          iVar2 = *(int *)(local_840.hit + 0xc);
                          iVar81 = *(int *)(local_840.hit + 0x10);
                          iVar82 = *(int *)(local_840.hit + 0x14);
                          iVar83 = *(int *)(local_840.hit + 0x18);
                          iVar84 = *(int *)(local_840.hit + 0x1c);
                          iVar85 = *(int *)(local_840.hit + 0x20);
                          iVar86 = *(int *)(local_840.hit + 0x24);
                          iVar87 = *(int *)(local_840.hit + 0x28);
                          iVar88 = *(int *)(local_840.hit + 0x2c);
                          iVar89 = *(int *)(local_840.hit + 0x30);
                          iVar90 = *(int *)(local_840.hit + 0x34);
                          iVar91 = *(int *)(local_840.hit + 0x38);
                          iVar92 = *(int *)(local_840.hit + 0x3c);
                          bVar109 = (byte)uVar106;
                          bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar106 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar106 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar106 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar106 >> 7) & 1);
                          bVar99 = (byte)(uVar106 >> 8);
                          bVar25 = (bool)((byte)(uVar106 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar106 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar106 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar106 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar106 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar106 >> 0xe) & 1);
                          bVar31 = SUB81(uVar106 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x300) =
                               (uint)(bVar109 & 1) * *(int *)local_840.hit |
                               (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x300);
                          *(uint *)(local_840.ray + 0x304) =
                               (uint)bVar18 * iVar103 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x304);
                          *(uint *)(local_840.ray + 0x308) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x308);
                          *(uint *)(local_840.ray + 0x30c) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x30c);
                          *(uint *)(local_840.ray + 0x310) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x310);
                          *(uint *)(local_840.ray + 0x314) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x314);
                          *(uint *)(local_840.ray + 0x318) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x318);
                          *(uint *)(local_840.ray + 0x31c) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x31c);
                          *(uint *)(local_840.ray + 800) =
                               (uint)(bVar99 & 1) * iVar85 |
                               (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 800);
                          *(uint *)(local_840.ray + 0x324) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x324);
                          *(uint *)(local_840.ray + 0x328) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x328);
                          *(uint *)(local_840.ray + 0x32c) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x32c);
                          *(uint *)(local_840.ray + 0x330) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x330);
                          *(uint *)(local_840.ray + 0x334) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x334);
                          *(uint *)(local_840.ray + 0x338) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x338);
                          *(uint *)(local_840.ray + 0x33c) =
                               (uint)bVar31 * iVar92 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x33c);
                          iVar103 = *(int *)(local_840.hit + 0x44);
                          iVar1 = *(int *)(local_840.hit + 0x48);
                          iVar2 = *(int *)(local_840.hit + 0x4c);
                          iVar81 = *(int *)(local_840.hit + 0x50);
                          iVar82 = *(int *)(local_840.hit + 0x54);
                          iVar83 = *(int *)(local_840.hit + 0x58);
                          iVar84 = *(int *)(local_840.hit + 0x5c);
                          iVar85 = *(int *)(local_840.hit + 0x60);
                          iVar86 = *(int *)(local_840.hit + 100);
                          iVar87 = *(int *)(local_840.hit + 0x68);
                          iVar88 = *(int *)(local_840.hit + 0x6c);
                          iVar89 = *(int *)(local_840.hit + 0x70);
                          iVar90 = *(int *)(local_840.hit + 0x74);
                          iVar91 = *(int *)(local_840.hit + 0x78);
                          iVar92 = *(int *)(local_840.hit + 0x7c);
                          bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar106 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar106 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar106 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar106 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar106 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar106 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar106 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar106 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar106 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar106 >> 0xe) & 1);
                          bVar31 = SUB81(uVar106 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x340) =
                               (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0x40) |
                               (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x340);
                          *(uint *)(local_840.ray + 0x344) =
                               (uint)bVar18 * iVar103 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x344);
                          *(uint *)(local_840.ray + 0x348) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x348);
                          *(uint *)(local_840.ray + 0x34c) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x34c);
                          *(uint *)(local_840.ray + 0x350) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x350);
                          *(uint *)(local_840.ray + 0x354) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x354);
                          *(uint *)(local_840.ray + 0x358) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x358);
                          *(uint *)(local_840.ray + 0x35c) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x35c);
                          *(uint *)(local_840.ray + 0x360) =
                               (uint)(bVar99 & 1) * iVar85 |
                               (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x360);
                          *(uint *)(local_840.ray + 0x364) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x364);
                          *(uint *)(local_840.ray + 0x368) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x368);
                          *(uint *)(local_840.ray + 0x36c) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x36c);
                          *(uint *)(local_840.ray + 0x370) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x370);
                          *(uint *)(local_840.ray + 0x374) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x374);
                          *(uint *)(local_840.ray + 0x378) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x378);
                          *(uint *)(local_840.ray + 0x37c) =
                               (uint)bVar31 * iVar92 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x37c);
                          iVar103 = *(int *)(local_840.hit + 0x84);
                          iVar1 = *(int *)(local_840.hit + 0x88);
                          iVar2 = *(int *)(local_840.hit + 0x8c);
                          iVar81 = *(int *)(local_840.hit + 0x90);
                          iVar82 = *(int *)(local_840.hit + 0x94);
                          iVar83 = *(int *)(local_840.hit + 0x98);
                          iVar84 = *(int *)(local_840.hit + 0x9c);
                          iVar85 = *(int *)(local_840.hit + 0xa0);
                          iVar86 = *(int *)(local_840.hit + 0xa4);
                          iVar87 = *(int *)(local_840.hit + 0xa8);
                          iVar88 = *(int *)(local_840.hit + 0xac);
                          iVar89 = *(int *)(local_840.hit + 0xb0);
                          iVar90 = *(int *)(local_840.hit + 0xb4);
                          iVar91 = *(int *)(local_840.hit + 0xb8);
                          iVar92 = *(int *)(local_840.hit + 0xbc);
                          bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar106 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar106 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar106 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar106 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar106 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar106 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar106 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar106 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar106 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar106 >> 0xe) & 1);
                          bVar31 = SUB81(uVar106 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x380) =
                               (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0x80) |
                               (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x380);
                          *(uint *)(local_840.ray + 900) =
                               (uint)bVar18 * iVar103 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 900);
                          *(uint *)(local_840.ray + 0x388) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x388);
                          *(uint *)(local_840.ray + 0x38c) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x38c);
                          *(uint *)(local_840.ray + 0x390) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x390);
                          *(uint *)(local_840.ray + 0x394) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x394);
                          *(uint *)(local_840.ray + 0x398) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x398);
                          *(uint *)(local_840.ray + 0x39c) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x39c);
                          *(uint *)(local_840.ray + 0x3a0) =
                               (uint)(bVar99 & 1) * iVar85 |
                               (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x3a0);
                          *(uint *)(local_840.ray + 0x3a4) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3a4);
                          *(uint *)(local_840.ray + 0x3a8) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x3a8);
                          *(uint *)(local_840.ray + 0x3ac) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x3ac);
                          *(uint *)(local_840.ray + 0x3b0) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x3b0);
                          *(uint *)(local_840.ray + 0x3b4) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x3b4);
                          *(uint *)(local_840.ray + 0x3b8) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x3b8);
                          *(uint *)(local_840.ray + 0x3bc) =
                               (uint)bVar31 * iVar92 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x3bc);
                          iVar103 = *(int *)(local_840.hit + 0xc4);
                          iVar1 = *(int *)(local_840.hit + 200);
                          iVar2 = *(int *)(local_840.hit + 0xcc);
                          iVar81 = *(int *)(local_840.hit + 0xd0);
                          iVar82 = *(int *)(local_840.hit + 0xd4);
                          iVar83 = *(int *)(local_840.hit + 0xd8);
                          iVar84 = *(int *)(local_840.hit + 0xdc);
                          iVar85 = *(int *)(local_840.hit + 0xe0);
                          iVar86 = *(int *)(local_840.hit + 0xe4);
                          iVar87 = *(int *)(local_840.hit + 0xe8);
                          iVar88 = *(int *)(local_840.hit + 0xec);
                          iVar89 = *(int *)(local_840.hit + 0xf0);
                          iVar90 = *(int *)(local_840.hit + 0xf4);
                          iVar91 = *(int *)(local_840.hit + 0xf8);
                          iVar92 = *(int *)(local_840.hit + 0xfc);
                          bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar106 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar106 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar106 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar106 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar106 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar106 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar106 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar106 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar106 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar106 >> 0xe) & 1);
                          bVar31 = SUB81(uVar106 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x3c0) =
                               (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0xc0) |
                               (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x3c0);
                          *(uint *)(local_840.ray + 0x3c4) =
                               (uint)bVar18 * iVar103 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x3c4);
                          *(uint *)(local_840.ray + 0x3c8) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x3c8);
                          *(uint *)(local_840.ray + 0x3cc) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x3cc);
                          *(uint *)(local_840.ray + 0x3d0) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x3d0);
                          *(uint *)(local_840.ray + 0x3d4) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x3d4);
                          *(uint *)(local_840.ray + 0x3d8) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x3d8);
                          *(uint *)(local_840.ray + 0x3dc) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x3dc);
                          *(uint *)(local_840.ray + 0x3e0) =
                               (uint)(bVar99 & 1) * iVar85 |
                               (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x3e0);
                          *(uint *)(local_840.ray + 0x3e4) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x3e4);
                          *(uint *)(local_840.ray + 1000) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 1000);
                          *(uint *)(local_840.ray + 0x3ec) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x3ec);
                          *(uint *)(local_840.ray + 0x3f0) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x3f0);
                          *(uint *)(local_840.ray + 0x3f4) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x3f4);
                          *(uint *)(local_840.ray + 0x3f8) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x3f8);
                          *(uint *)(local_840.ray + 0x3fc) =
                               (uint)bVar31 * iVar92 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x3fc);
                          iVar103 = *(int *)(local_840.hit + 0x104);
                          iVar1 = *(int *)(local_840.hit + 0x108);
                          iVar2 = *(int *)(local_840.hit + 0x10c);
                          iVar81 = *(int *)(local_840.hit + 0x110);
                          iVar82 = *(int *)(local_840.hit + 0x114);
                          iVar83 = *(int *)(local_840.hit + 0x118);
                          iVar84 = *(int *)(local_840.hit + 0x11c);
                          iVar85 = *(int *)(local_840.hit + 0x120);
                          iVar86 = *(int *)(local_840.hit + 0x124);
                          iVar87 = *(int *)(local_840.hit + 0x128);
                          iVar88 = *(int *)(local_840.hit + 300);
                          iVar89 = *(int *)(local_840.hit + 0x130);
                          iVar90 = *(int *)(local_840.hit + 0x134);
                          iVar91 = *(int *)(local_840.hit + 0x138);
                          iVar92 = *(int *)(local_840.hit + 0x13c);
                          bVar18 = (bool)((byte)(uVar106 >> 1) & 1);
                          bVar19 = (bool)((byte)(uVar106 >> 2) & 1);
                          bVar20 = (bool)((byte)(uVar106 >> 3) & 1);
                          bVar21 = (bool)((byte)(uVar106 >> 4) & 1);
                          bVar22 = (bool)((byte)(uVar106 >> 5) & 1);
                          bVar23 = (bool)((byte)(uVar106 >> 6) & 1);
                          bVar24 = (bool)((byte)(uVar106 >> 7) & 1);
                          bVar25 = (bool)((byte)(uVar106 >> 9) & 1);
                          bVar26 = (bool)((byte)(uVar106 >> 10) & 1);
                          bVar27 = (bool)((byte)(uVar106 >> 0xb) & 1);
                          bVar28 = (bool)((byte)(uVar106 >> 0xc) & 1);
                          bVar29 = (bool)((byte)(uVar106 >> 0xd) & 1);
                          bVar30 = (bool)((byte)(uVar106 >> 0xe) & 1);
                          bVar31 = SUB81(uVar106 >> 0xf,0);
                          *(uint *)(local_840.ray + 0x400) =
                               (uint)(bVar109 & 1) * *(int *)(local_840.hit + 0x100) |
                               (uint)!(bool)(bVar109 & 1) * *(int *)(local_840.ray + 0x400);
                          *(uint *)(local_840.ray + 0x404) =
                               (uint)bVar18 * iVar103 |
                               (uint)!bVar18 * *(int *)(local_840.ray + 0x404);
                          *(uint *)(local_840.ray + 0x408) =
                               (uint)bVar19 * iVar1 |
                               (uint)!bVar19 * *(int *)(local_840.ray + 0x408);
                          *(uint *)(local_840.ray + 0x40c) =
                               (uint)bVar20 * iVar2 |
                               (uint)!bVar20 * *(int *)(local_840.ray + 0x40c);
                          *(uint *)(local_840.ray + 0x410) =
                               (uint)bVar21 * iVar81 |
                               (uint)!bVar21 * *(int *)(local_840.ray + 0x410);
                          *(uint *)(local_840.ray + 0x414) =
                               (uint)bVar22 * iVar82 |
                               (uint)!bVar22 * *(int *)(local_840.ray + 0x414);
                          *(uint *)(local_840.ray + 0x418) =
                               (uint)bVar23 * iVar83 |
                               (uint)!bVar23 * *(int *)(local_840.ray + 0x418);
                          *(uint *)(local_840.ray + 0x41c) =
                               (uint)bVar24 * iVar84 |
                               (uint)!bVar24 * *(int *)(local_840.ray + 0x41c);
                          *(uint *)(local_840.ray + 0x420) =
                               (uint)(bVar99 & 1) * iVar85 |
                               (uint)!(bool)(bVar99 & 1) * *(int *)(local_840.ray + 0x420);
                          *(uint *)(local_840.ray + 0x424) =
                               (uint)bVar25 * iVar86 |
                               (uint)!bVar25 * *(int *)(local_840.ray + 0x424);
                          *(uint *)(local_840.ray + 0x428) =
                               (uint)bVar26 * iVar87 |
                               (uint)!bVar26 * *(int *)(local_840.ray + 0x428);
                          *(uint *)(local_840.ray + 0x42c) =
                               (uint)bVar27 * iVar88 |
                               (uint)!bVar27 * *(int *)(local_840.ray + 0x42c);
                          *(uint *)(local_840.ray + 0x430) =
                               (uint)bVar28 * iVar89 |
                               (uint)!bVar28 * *(int *)(local_840.ray + 0x430);
                          *(uint *)(local_840.ray + 0x434) =
                               (uint)bVar29 * iVar90 |
                               (uint)!bVar29 * *(int *)(local_840.ray + 0x434);
                          *(uint *)(local_840.ray + 0x438) =
                               (uint)bVar30 * iVar91 |
                               (uint)!bVar30 * *(int *)(local_840.ray + 0x438);
                          *(uint *)(local_840.ray + 0x43c) =
                               (uint)bVar31 * iVar92 |
                               (uint)!bVar31 * *(int *)(local_840.ray + 0x43c);
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x140)
                                                      );
                          auVar183 = vmovdqu32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x440) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x180)
                                                      );
                          auVar183 = vmovdqu32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x480) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x1c0)
                                                      );
                          auVar183 = vmovdqa32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x4c0) = auVar183;
                          auVar183 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_840.hit + 0x200)
                                                      );
                          auVar183 = vmovdqa32_avx512f(auVar183);
                          *(undefined1 (*) [64])(local_840.ray + 0x500) = auVar183;
                          auVar238 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
                        }
                        auVar222 = ZEXT1664(auVar32);
                        bVar109 = ~(byte)(1 << ((uint)uVar100 & 0x1f)) & (byte)uVar104;
                        uVar171 = auVar238._0_4_;
                        auVar179._4_4_ = uVar171;
                        auVar179._0_4_ = uVar171;
                        auVar179._8_4_ = uVar171;
                        auVar179._12_4_ = uVar171;
                        auVar179._16_4_ = uVar171;
                        auVar179._20_4_ = uVar171;
                        auVar179._24_4_ = uVar171;
                        auVar179._28_4_ = uVar171;
                        uVar34 = vcmpps_avx512vl(auVar239._0_32_,auVar179,2);
                        if ((bVar109 & (byte)uVar34) == 0) goto LAB_01d62ee3;
                        bVar109 = bVar109 & (byte)uVar34;
                        uVar104 = (ulong)bVar109;
                        auVar180._8_4_ = 0x7f800000;
                        auVar180._0_8_ = 0x7f8000007f800000;
                        auVar180._12_4_ = 0x7f800000;
                        auVar180._16_4_ = 0x7f800000;
                        auVar180._20_4_ = 0x7f800000;
                        auVar180._24_4_ = 0x7f800000;
                        auVar180._28_4_ = 0x7f800000;
                        auVar125 = vblendmps_avx512vl(auVar180,auVar239._0_32_);
                        auVar160._0_4_ =
                             (uint)(bVar109 & 1) * auVar125._0_4_ |
                             (uint)!(bool)(bVar109 & 1) * 0x7f800000;
                        bVar18 = (bool)(bVar109 >> 1 & 1);
                        auVar160._4_4_ = (uint)bVar18 * auVar125._4_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar109 >> 2 & 1);
                        auVar160._8_4_ = (uint)bVar18 * auVar125._8_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar109 >> 3 & 1);
                        auVar160._12_4_ =
                             (uint)bVar18 * auVar125._12_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar109 >> 4 & 1);
                        auVar160._16_4_ =
                             (uint)bVar18 * auVar125._16_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar109 >> 5 & 1);
                        auVar160._20_4_ =
                             (uint)bVar18 * auVar125._20_4_ | (uint)!bVar18 * 0x7f800000;
                        bVar18 = (bool)(bVar109 >> 6 & 1);
                        auVar160._24_4_ =
                             (uint)bVar18 * auVar125._24_4_ | (uint)!bVar18 * 0x7f800000;
                        auVar160._28_4_ =
                             (uint)(bVar109 >> 7) * auVar125._28_4_ |
                             (uint)!(bool)(bVar109 >> 7) * 0x7f800000;
                        auVar125 = vshufps_avx(auVar160,auVar160,0xb1);
                        auVar125 = vminps_avx(auVar160,auVar125);
                        auVar123 = vshufpd_avx(auVar125,auVar125,5);
                        auVar125 = vminps_avx(auVar125,auVar123);
                        auVar123 = vpermpd_avx2(auVar125,0x4e);
                        auVar125 = vminps_avx(auVar125,auVar123);
                        uVar34 = vcmpps_avx512vl(auVar160,auVar125,0);
                        bVar99 = (byte)uVar34 & bVar109;
                        if (bVar99 != 0) {
                          bVar109 = bVar99;
                        }
                        uVar101 = 0;
                        for (uVar102 = (uint)bVar109; (uVar102 & 1) == 0;
                            uVar102 = uVar102 >> 1 | 0x80000000) {
                          uVar101 = uVar101 + 1;
                        }
                        uVar100 = (ulong)uVar101;
                      } while( true );
                    }
                    fVar188 = local_500[uVar100];
                    uVar171 = *(undefined4 *)(local_4e0 + uVar100 * 4);
                    fVar184 = 1.0 - fVar188;
                    fVar170 = fVar184 * fVar184 * -3.0;
                    auVar213 = ZEXT464((uint)fVar170);
                    auVar117 = vfmadd231ss_fma(ZEXT416((uint)(fVar184 * fVar184)),
                                               ZEXT416((uint)(fVar188 * fVar184)),
                                               ZEXT416(0xc0000000));
                    auVar118 = vfmsub132ss_fma(ZEXT416((uint)(fVar188 * fVar184)),
                                               ZEXT416((uint)(fVar188 * fVar188)),
                                               ZEXT416(0x40000000));
                    fVar184 = auVar117._0_4_ * 3.0;
                    fVar185 = auVar118._0_4_ * 3.0;
                    fVar197 = fVar188 * fVar188 * 3.0;
                    auVar215._0_4_ = fVar197 * local_880;
                    auVar215._4_4_ = fVar197 * fStack_87c;
                    auVar215._8_4_ = fVar197 * fStack_878;
                    auVar215._12_4_ = fVar197 * fStack_874;
                    auVar218 = ZEXT1664(auVar215);
                    auVar191._4_4_ = fVar185;
                    auVar191._0_4_ = fVar185;
                    auVar191._8_4_ = fVar185;
                    auVar191._12_4_ = fVar185;
                    auVar117 = vfmadd132ps_fma(auVar191,auVar215,auVar10);
                    auVar201._4_4_ = fVar184;
                    auVar201._0_4_ = fVar184;
                    auVar201._8_4_ = fVar184;
                    auVar201._12_4_ = fVar184;
                    auVar117 = vfmadd132ps_fma(auVar201,auVar117,auVar11);
                    auVar192._4_4_ = fVar170;
                    auVar192._0_4_ = fVar170;
                    auVar192._8_4_ = fVar170;
                    auVar192._12_4_ = fVar170;
                    auVar117 = vfmadd213ps_fma(auVar192,auVar32,auVar117);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4c0 + uVar100 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar117._0_4_;
                    uVar16 = vextractps_avx(auVar117,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar16;
                    uVar16 = vextractps_avx(auVar117,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar16;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar188;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar171;
                    *(uint *)(ray + k * 4 + 0x440) = uVar15;
                    *(uint *)(ray + k * 4 + 0x480) = uVar105;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01d62b0b;
      }
LAB_01d621a4:
      uVar171 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar43._4_4_ = uVar171;
      auVar43._0_4_ = uVar171;
      auVar43._8_4_ = uVar171;
      auVar43._12_4_ = uVar171;
      auVar43._16_4_ = uVar171;
      auVar43._20_4_ = uVar171;
      auVar43._24_4_ = uVar171;
      auVar43._28_4_ = uVar171;
      uVar33 = vcmpps_avx512vl(local_320,auVar43,2);
      uVar105 = (uint)uVar106 & (uint)uVar33;
      uVar106 = (ulong)uVar105;
    } while (uVar105 != 0);
  }
  return;
LAB_01d62ee3:
  auVar183 = ZEXT3264(local_760);
  auVar240 = ZEXT3264(local_780);
  auVar125 = vmovdqa64_avx512vl(local_3c0);
  auVar224 = ZEXT3264(auVar125);
  uVar106 = local_808;
  iVar103 = local_7c0._0_4_;
LAB_01d62b0b:
  lVar107 = lVar107 + 8;
  if (iVar103 <= (int)lVar107) goto LAB_01d621a4;
  goto LAB_01d6224a;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }